

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  size_t k;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [28];
  int iVar72;
  ulong uVar73;
  long lVar74;
  undefined1 (*pauVar75) [32];
  undefined1 auVar76 [8];
  ulong uVar77;
  ulong *puVar78;
  NodeRef root;
  ulong uVar79;
  undefined4 uVar80;
  ulong unaff_R15;
  bool bVar81;
  float fVar82;
  float fVar92;
  float fVar94;
  float fVar96;
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 extraout_var [56];
  float fVar115;
  float fVar131;
  undefined1 auVar117 [16];
  float fVar116;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar128;
  float fVar130;
  float fVar132;
  float fVar134;
  float fVar136;
  float fVar138;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar127;
  float fVar129;
  float fVar133;
  float fVar135;
  float fVar137;
  undefined1 in_ZMM2 [64];
  undefined1 auVar126 [64];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar157 [16];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar172 [32];
  float fVar174;
  undefined1 auVar173 [64];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar175 [32];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5fc1;
  ulong local_5fc0;
  ulong local_5fb8;
  RayK<8> *local_5fb0;
  RayQueryContext *local_5fa8;
  undefined1 local_5fa0 [56];
  RayK<8> *local_5f68;
  undefined1 local_5f60 [32];
  undefined1 local_5f40 [8];
  undefined1 auStack_5f38 [8];
  float fStack_5f30;
  float fStack_5f2c;
  float fStack_5f28;
  undefined1 (*local_5f18) [32];
  RTCFilterFunctionNArguments local_5f10;
  undefined1 local_5ee0 [32];
  undefined1 local_5ec0 [32];
  BVH *local_5ea0;
  Intersectors *local_5e98;
  ulong local_5e90;
  long local_5e88;
  undefined1 local_5e80 [32];
  undefined1 local_5e60 [32];
  undefined1 local_5e40 [32];
  undefined8 local_5e10;
  undefined8 uStack_5e08;
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [32];
  undefined1 local_5dc0 [32];
  undefined1 local_5da0 [32];
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  undefined1 local_5d20 [32];
  undefined1 local_5d00 [32];
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  RTCHitN local_5c60 [32];
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  uint local_5ba0;
  uint uStack_5b9c;
  uint uStack_5b98;
  uint uStack_5b94;
  uint uStack_5b90;
  uint uStack_5b8c;
  uint uStack_5b88;
  uint uStack_5b84;
  uint local_5b80;
  uint uStack_5b7c;
  uint uStack_5b78;
  uint uStack_5b74;
  uint uStack_5b70;
  uint uStack_5b6c;
  uint uStack_5b68;
  uint uStack_5b64;
  uint local_5b60;
  uint uStack_5b5c;
  uint uStack_5b58;
  uint uStack_5b54;
  uint uStack_5b50;
  uint uStack_5b4c;
  uint uStack_5b48;
  uint uStack_5b44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b40;
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [8];
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  undefined1 local_5a60 [8];
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  undefined1 local_5a40 [8];
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 uStack_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined4 local_5840;
  undefined4 uStack_583c;
  undefined4 uStack_5838;
  undefined4 uStack_5834;
  undefined4 uStack_5830;
  undefined4 uStack_582c;
  undefined4 uStack_5828;
  undefined4 uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  float fVar91;
  float fVar93;
  float fVar95;
  undefined1 auVar160 [32];
  
  local_5ea0 = (BVH *)This->ptr;
  local_5808 = (local_5ea0->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar125 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar97 = ZEXT816(0) << 0x40;
      auVar110 = vpcmpeqd_avx2(auVar125,(undefined1  [32])valid_i->field_0);
      auVar125 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar97),5);
      auVar106 = auVar110 & auVar125;
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0x7f,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar106 >> 0xbf,0) != '\0') ||
          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar106[0x1f] < '\0') {
        auVar125 = vandps_avx(auVar125,auVar110);
        auVar148 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
        auVar126 = ZEXT1664(auVar148);
        local_5b40._0_8_ = *(undefined8 *)ray;
        local_5b40._8_8_ = *(undefined8 *)(ray + 8);
        local_5b40._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5b40._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5b40._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5b40._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5b40._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5b40._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5b40._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5b40._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5b40._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5b40._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5ae0 = *(undefined1 (*) [32])(ray + 0x80);
        local_5ac0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5c80._8_4_ = 0x7fffffff;
        local_5c80._0_8_ = 0x7fffffff7fffffff;
        local_5c80._12_4_ = 0x7fffffff;
        local_5c80._16_4_ = 0x7fffffff;
        local_5c80._20_4_ = 0x7fffffff;
        local_5c80._24_4_ = 0x7fffffff;
        local_5c80._28_4_ = 0x7fffffff;
        auVar86._8_4_ = 0x219392ef;
        auVar86._0_8_ = 0x219392ef219392ef;
        auVar86._12_4_ = 0x219392ef;
        auVar86._16_4_ = 0x219392ef;
        auVar86._20_4_ = 0x219392ef;
        auVar86._24_4_ = 0x219392ef;
        auVar86._28_4_ = 0x219392ef;
        auVar167 = ZEXT3264(auVar86);
        auVar160._8_4_ = 0x3f800000;
        auVar160._0_8_ = 0x3f8000003f800000;
        auVar160._12_4_ = 0x3f800000;
        auVar160._16_4_ = 0x3f800000;
        auVar160._20_4_ = 0x3f800000;
        auVar160._24_4_ = 0x3f800000;
        auVar160._28_4_ = 0x3f800000;
        local_5aa0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar144 = vdivps_avx(auVar160,local_5ae0);
        auVar125 = vandps_avx(local_5c80,local_5ae0);
        auVar106 = vcmpps_avx(auVar125,auVar86,1);
        auVar125 = vandps_avx(local_5c80,local_5ac0);
        auVar110 = vcmpps_avx(auVar125,auVar86,1);
        auVar111 = vdivps_avx(auVar160,local_5ac0);
        auVar125 = vandps_avx(local_5c80,local_5aa0);
        auVar163._8_4_ = 0x5d5e0b6b;
        auVar163._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar163._12_4_ = 0x5d5e0b6b;
        auVar163._16_4_ = 0x5d5e0b6b;
        auVar163._20_4_ = 0x5d5e0b6b;
        auVar163._24_4_ = 0x5d5e0b6b;
        auVar163._28_4_ = 0x5d5e0b6b;
        _local_5a80 = vblendvps_avx(auVar144,auVar163,auVar106);
        auVar125 = vcmpps_avx(auVar125,auVar86,1);
        auVar106 = vdivps_avx(auVar160,local_5aa0);
        auVar161 = ZEXT3264(auVar106);
        _local_5a60 = vblendvps_avx(auVar111,auVar163,auVar110);
        _local_5a40 = vblendvps_avx(auVar106,auVar163,auVar125);
        auVar152 = ZEXT3264(_local_5a40);
        auVar125 = vcmpps_avx(_local_5a80,ZEXT1632(auVar97),1);
        auVar111._8_4_ = 0x20;
        auVar111._0_8_ = 0x2000000020;
        auVar111._12_4_ = 0x20;
        auVar111._16_4_ = 0x20;
        auVar111._20_4_ = 0x20;
        auVar111._24_4_ = 0x20;
        auVar111._28_4_ = 0x20;
        local_5a20 = vandps_avx(auVar125,auVar111);
        auVar106 = ZEXT1632(auVar97);
        auVar125 = vcmpps_avx(_local_5a60,auVar106,5);
        auVar110._8_4_ = 0x40;
        auVar110._0_8_ = 0x4000000040;
        auVar110._12_4_ = 0x40;
        auVar110._16_4_ = 0x40;
        auVar110._20_4_ = 0x40;
        auVar110._24_4_ = 0x40;
        auVar110._28_4_ = 0x40;
        auVar107._8_4_ = 0x60;
        auVar107._0_8_ = 0x6000000060;
        auVar107._12_4_ = 0x60;
        auVar107._16_4_ = 0x60;
        auVar107._20_4_ = 0x60;
        auVar107._24_4_ = 0x60;
        auVar107._28_4_ = 0x60;
        local_5a00 = vblendvps_avx(auVar107,auVar110,auVar125);
        auVar125 = vcmpps_avx(_local_5a40,auVar106,5);
        auVar144._8_4_ = 0x80;
        auVar144._0_8_ = 0x8000000080;
        auVar144._12_4_ = 0x80;
        auVar144._16_4_ = 0x80;
        auVar144._20_4_ = 0x80;
        auVar144._24_4_ = 0x80;
        auVar144._28_4_ = 0x80;
        auVar147._8_4_ = 0xa0;
        auVar147._0_8_ = 0xa0000000a0;
        auVar147._12_4_ = 0xa0;
        auVar147._16_4_ = 0xa0;
        auVar147._20_4_ = 0xa0;
        auVar147._24_4_ = 0xa0;
        auVar147._28_4_ = 0xa0;
        local_59e0 = vblendvps_avx(auVar147,auVar144,auVar125);
        auVar125 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar106);
        local_5980 = vpmovsxwd_avx2(auVar148);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar171 = ZEXT3264(local_4680);
        local_59c0 = vblendvps_avx(local_4680,auVar125,local_5980);
        auVar125 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar106);
        auVar106._8_4_ = 0xff800000;
        auVar106._0_8_ = 0xff800000ff800000;
        auVar106._12_4_ = 0xff800000;
        auVar106._16_4_ = 0xff800000;
        auVar106._20_4_ = 0xff800000;
        auVar106._24_4_ = 0xff800000;
        auVar106._28_4_ = 0xff800000;
        local_59a0 = vblendvps_avx(auVar106,auVar125,local_5980);
        auVar97 = vpcmpeqd_avx(local_59a0._0_16_,local_59a0._0_16_);
        local_5e40 = vpmovsxwd_avx2(auVar148 ^ auVar97);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar77 = 7;
        }
        else {
          uVar77 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_5f68 = ray + 0x100;
        puVar78 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar75 = (undefined1 (*) [32])local_4640;
        local_4660 = local_59c0;
        local_5940 = mm_lookupmask_ps._16_8_;
        uStack_5938 = mm_lookupmask_ps._24_8_;
        uStack_5930 = mm_lookupmask_ps._16_8_;
        uStack_5928 = mm_lookupmask_ps._24_8_;
        local_5f18 = (undefined1 (*) [32])&local_5b80;
        local_5960 = mm_lookupmask_pd._0_8_;
        uStack_5958 = mm_lookupmask_pd._8_8_;
        uStack_5950 = mm_lookupmask_pd._0_8_;
        uStack_5948 = mm_lookupmask_pd._8_8_;
        auVar173 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        local_5fb8 = uVar77;
        local_5fb0 = ray;
        local_5fa8 = context;
        local_5e98 = This;
LAB_00607334:
        do {
          do {
            root.ptr = puVar78[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_006086e3;
            puVar78 = puVar78 + -1;
            pauVar75 = pauVar75 + -1;
            local_5f60 = *pauVar75;
            auVar143 = ZEXT3264(local_5f60);
            auVar125 = vcmpps_avx(local_5f60,local_59a0,1);
          } while ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar125 >> 0x7f,0) == '\0') &&
                     (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar125 >> 0xbf,0) == '\0') &&
                   (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar125[0x1f]);
          uVar80 = vmovmskps_avx(auVar125);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar80);
          if (uVar77 < (uint)POPCOUNT(uVar80)) {
LAB_00607372:
            do {
              uVar73 = 8;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_006086e3;
                auVar125 = vcmpps_avx(local_59a0,auVar143._0_32_,6);
                if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar125 >> 0x7f,0) == '\0') &&
                      (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar125 >> 0xbf,0) == '\0') &&
                    (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar125[0x1f]) goto LAB_00607334;
                auVar76 = (undefined1  [8])((ulong)((uint)root.ptr & 0xf) - 8);
                if (auVar76 != (undefined1  [8])0x0) {
                  auVar104._0_8_ = local_5e40._0_8_ ^ 0xffffffffffffffff;
                  auVar104._8_4_ = local_5e40._8_4_ ^ 0xffffffff;
                  auVar104._12_4_ = local_5e40._12_4_ ^ 0xffffffff;
                  auVar104._16_4_ = local_5e40._16_4_ ^ 0xffffffff;
                  auVar104._20_4_ = local_5e40._20_4_ ^ 0xffffffff;
                  auVar104._24_4_ = local_5e40._24_4_ ^ 0xffffffff;
                  auVar104._28_4_ = local_5e40._28_4_ ^ 0xffffffff;
                  unaff_R15 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                  uVar73 = 0;
                  goto LAB_00607560;
                }
                auVar125 = vpcmpeqd_avx2(auVar126._0_32_,auVar126._0_32_);
                auVar90 = local_5e40;
                goto LAB_006085bc;
              }
              lVar74 = 0;
              auVar125 = auVar171._0_32_;
              do {
                uVar79 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar74 * 8);
                if (uVar79 == 8) {
                  auVar143 = ZEXT3264(auVar125);
                  break;
                }
                uVar80 = *(undefined4 *)(root.ptr + 0x40 + lVar74 * 4);
                auVar98._4_4_ = uVar80;
                auVar98._0_4_ = uVar80;
                auVar98._8_4_ = uVar80;
                auVar98._12_4_ = uVar80;
                auVar98._16_4_ = uVar80;
                auVar98._20_4_ = uVar80;
                auVar98._24_4_ = uVar80;
                auVar98._28_4_ = uVar80;
                auVar65._8_8_ = local_5b40._8_8_;
                auVar65._0_8_ = local_5b40._0_8_;
                auVar65._16_8_ = local_5b40._16_8_;
                auVar65._24_8_ = local_5b40._24_8_;
                auVar66._8_8_ = local_5b40._40_8_;
                auVar66._0_8_ = local_5b40._32_8_;
                auVar66._16_8_ = local_5b40._48_8_;
                auVar66._24_8_ = local_5b40._56_8_;
                auVar67._8_8_ = local_5b40._72_8_;
                auVar67._0_8_ = local_5b40._64_8_;
                auVar67._16_8_ = local_5b40._80_8_;
                auVar67._24_8_ = local_5b40._88_8_;
                auVar106 = vsubps_avx(auVar98,auVar65);
                auVar143._0_4_ = (float)local_5a80._0_4_ * auVar106._0_4_;
                auVar143._4_4_ = (float)local_5a80._4_4_ * auVar106._4_4_;
                auVar143._8_4_ = fStack_5a78 * auVar106._8_4_;
                auVar143._12_4_ = fStack_5a74 * auVar106._12_4_;
                auVar143._16_4_ = fStack_5a70 * auVar106._16_4_;
                auVar143._20_4_ = fStack_5a6c * auVar106._20_4_;
                auVar143._28_36_ = auVar152._28_36_;
                auVar143._24_4_ = fStack_5a68 * auVar106._24_4_;
                auVar144 = auVar143._0_32_;
                auVar152 = ZEXT3264(auVar144);
                uVar80 = *(undefined4 *)(root.ptr + 0x80 + lVar74 * 4);
                auVar99._4_4_ = uVar80;
                auVar99._0_4_ = uVar80;
                auVar99._8_4_ = uVar80;
                auVar99._12_4_ = uVar80;
                auVar99._16_4_ = uVar80;
                auVar99._20_4_ = uVar80;
                auVar99._24_4_ = uVar80;
                auVar99._28_4_ = uVar80;
                auVar106 = vsubps_avx(auVar99,auVar66);
                auVar162._0_4_ = (float)local_5a60._0_4_ * auVar106._0_4_;
                auVar162._4_4_ = (float)local_5a60._4_4_ * auVar106._4_4_;
                auVar162._8_4_ = fStack_5a58 * auVar106._8_4_;
                auVar162._12_4_ = fStack_5a54 * auVar106._12_4_;
                auVar162._16_4_ = fStack_5a50 * auVar106._16_4_;
                auVar162._20_4_ = fStack_5a4c * auVar106._20_4_;
                auVar162._28_36_ = auVar161._28_36_;
                auVar162._24_4_ = fStack_5a48 * auVar106._24_4_;
                auVar111 = auVar162._0_32_;
                auVar161 = ZEXT3264(auVar111);
                uVar80 = *(undefined4 *)(root.ptr + 0xc0 + lVar74 * 4);
                auVar100._4_4_ = uVar80;
                auVar100._0_4_ = uVar80;
                auVar100._8_4_ = uVar80;
                auVar100._12_4_ = uVar80;
                auVar100._16_4_ = uVar80;
                auVar100._20_4_ = uVar80;
                auVar100._24_4_ = uVar80;
                auVar100._28_4_ = uVar80;
                auVar106 = vsubps_avx(auVar100,auVar67);
                auVar168._0_4_ = (float)local_5a40._0_4_ * auVar106._0_4_;
                auVar168._4_4_ = (float)local_5a40._4_4_ * auVar106._4_4_;
                auVar168._8_4_ = fStack_5a38 * auVar106._8_4_;
                auVar168._12_4_ = fStack_5a34 * auVar106._12_4_;
                auVar168._16_4_ = fStack_5a30 * auVar106._16_4_;
                auVar168._20_4_ = fStack_5a2c * auVar106._20_4_;
                auVar168._28_36_ = auVar167._28_36_;
                auVar168._24_4_ = fStack_5a28 * auVar106._24_4_;
                auVar107 = auVar168._0_32_;
                auVar167 = ZEXT3264(auVar107);
                uVar80 = *(undefined4 *)(root.ptr + 0x60 + lVar74 * 4);
                auVar101._4_4_ = uVar80;
                auVar101._0_4_ = uVar80;
                auVar101._8_4_ = uVar80;
                auVar101._12_4_ = uVar80;
                auVar101._16_4_ = uVar80;
                auVar101._20_4_ = uVar80;
                auVar101._24_4_ = uVar80;
                auVar101._28_4_ = uVar80;
                auVar106 = vsubps_avx(auVar101,auVar65);
                auVar18._4_4_ = (float)local_5a80._4_4_ * auVar106._4_4_;
                auVar18._0_4_ = (float)local_5a80._0_4_ * auVar106._0_4_;
                auVar18._8_4_ = fStack_5a78 * auVar106._8_4_;
                auVar18._12_4_ = fStack_5a74 * auVar106._12_4_;
                auVar18._16_4_ = fStack_5a70 * auVar106._16_4_;
                auVar18._20_4_ = fStack_5a6c * auVar106._20_4_;
                auVar18._24_4_ = fStack_5a68 * auVar106._24_4_;
                auVar18._28_4_ = (int)((ulong)local_5b40._24_8_ >> 0x20);
                uVar80 = *(undefined4 *)(root.ptr + 0xa0 + lVar74 * 4);
                auVar102._4_4_ = uVar80;
                auVar102._0_4_ = uVar80;
                auVar102._8_4_ = uVar80;
                auVar102._12_4_ = uVar80;
                auVar102._16_4_ = uVar80;
                auVar102._20_4_ = uVar80;
                auVar102._24_4_ = uVar80;
                auVar102._28_4_ = uVar80;
                auVar106 = vsubps_avx(auVar102,auVar66);
                auVar19._4_4_ = (float)local_5a60._4_4_ * auVar106._4_4_;
                auVar19._0_4_ = (float)local_5a60._0_4_ * auVar106._0_4_;
                auVar19._8_4_ = fStack_5a58 * auVar106._8_4_;
                auVar19._12_4_ = fStack_5a54 * auVar106._12_4_;
                auVar19._16_4_ = fStack_5a50 * auVar106._16_4_;
                auVar19._20_4_ = fStack_5a4c * auVar106._20_4_;
                auVar19._24_4_ = fStack_5a48 * auVar106._24_4_;
                auVar19._28_4_ = (int)((ulong)local_5b40._56_8_ >> 0x20);
                uVar80 = *(undefined4 *)(root.ptr + 0xe0 + lVar74 * 4);
                auVar103._4_4_ = uVar80;
                auVar103._0_4_ = uVar80;
                auVar103._8_4_ = uVar80;
                auVar103._12_4_ = uVar80;
                auVar103._16_4_ = uVar80;
                auVar103._20_4_ = uVar80;
                auVar103._24_4_ = uVar80;
                auVar103._28_4_ = uVar80;
                auVar106 = vsubps_avx(auVar103,auVar67);
                auVar20._4_4_ = (float)local_5a40._4_4_ * auVar106._4_4_;
                auVar20._0_4_ = (float)local_5a40._0_4_ * auVar106._0_4_;
                auVar20._8_4_ = fStack_5a38 * auVar106._8_4_;
                auVar20._12_4_ = fStack_5a34 * auVar106._12_4_;
                auVar20._16_4_ = fStack_5a30 * auVar106._16_4_;
                auVar20._20_4_ = fStack_5a2c * auVar106._20_4_;
                auVar20._24_4_ = fStack_5a28 * auVar106._24_4_;
                auVar20._28_4_ = (int)((ulong)local_5b40._88_8_ >> 0x20);
                auVar106 = vminps_avx(auVar144,auVar18);
                auVar110 = vminps_avx(auVar111,auVar19);
                auVar106 = vmaxps_avx(auVar106,auVar110);
                auVar110 = vminps_avx(auVar107,auVar20);
                auVar106 = vmaxps_avx(auVar106,auVar110);
                auVar21._4_4_ = auVar173._4_4_ * auVar106._4_4_;
                auVar21._0_4_ = auVar173._0_4_ * auVar106._0_4_;
                auVar21._8_4_ = auVar173._8_4_ * auVar106._8_4_;
                auVar21._12_4_ = auVar173._12_4_ * auVar106._12_4_;
                auVar21._16_4_ = auVar173._16_4_ * auVar106._16_4_;
                auVar21._20_4_ = auVar173._20_4_ * auVar106._20_4_;
                auVar21._24_4_ = auVar173._24_4_ * auVar106._24_4_;
                auVar21._28_4_ = auVar106._28_4_;
                auVar106 = vmaxps_avx(auVar144,auVar18);
                auVar110 = vmaxps_avx(auVar111,auVar19);
                auVar110 = vminps_avx(auVar106,auVar110);
                auVar106 = vmaxps_avx(auVar107,auVar20);
                auVar106 = vminps_avx(auVar110,auVar106);
                auVar22._4_4_ = auVar106._4_4_ * 1.0000004;
                auVar22._0_4_ = auVar106._0_4_ * 1.0000004;
                auVar22._8_4_ = auVar106._8_4_ * 1.0000004;
                auVar22._12_4_ = auVar106._12_4_ * 1.0000004;
                auVar22._16_4_ = auVar106._16_4_ * 1.0000004;
                auVar22._20_4_ = auVar106._20_4_ * 1.0000004;
                auVar22._24_4_ = auVar106._24_4_ * 1.0000004;
                auVar22._28_4_ = auVar106._28_4_;
                auVar106 = vmaxps_avx(auVar21,local_59c0);
                auVar110 = vminps_avx(auVar22,local_59a0);
                auVar106 = vcmpps_avx(auVar106,auVar110,2);
                auVar126 = ZEXT3264(auVar106);
                if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar106 >> 0x7f,0) == '\0') &&
                      (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar106 >> 0xbf,0) == '\0') &&
                    (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar106[0x1f]) {
                  auVar143 = ZEXT3264(auVar125);
                  uVar79 = uVar73;
                }
                else {
                  auVar106 = vblendvps_avx(auVar171._0_32_,auVar21,auVar106);
                  auVar143 = ZEXT3264(auVar106);
                  if (uVar73 != 8) {
                    *puVar78 = uVar73;
                    puVar78 = puVar78 + 1;
                    *pauVar75 = auVar125;
                    pauVar75 = pauVar75 + 1;
                  }
                }
                uVar73 = uVar79;
                lVar74 = lVar74 + 1;
                auVar125 = auVar143._0_32_;
              } while (lVar74 != 8);
              if (uVar73 == 8) goto LAB_006074fe;
              auVar125 = vcmpps_avx(local_59a0,auVar143._0_32_,6);
              uVar80 = vmovmskps_avx(auVar125);
              root.ptr = uVar73;
            } while ((byte)uVar77 < (byte)POPCOUNT(uVar80));
            *puVar78 = uVar73;
            puVar78 = puVar78 + 1;
            *pauVar75 = auVar143._0_32_;
            pauVar75 = pauVar75 + 1;
LAB_006074fe:
            iVar72 = 4;
          }
          else {
            for (; unaff_R15 != 0; unaff_R15 = unaff_R15 - 1 & unaff_R15) {
              k = 0;
              for (uVar77 = unaff_R15; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000)
              {
                k = k + 1;
              }
              local_5fa0._0_8_ = k;
              auVar126 = ZEXT1664(auVar126._0_16_);
              auVar152 = ZEXT1664(auVar152._0_16_);
              auVar161 = ZEXT1664(auVar161._0_16_);
              auVar167 = ZEXT1664(auVar167._0_16_);
              bVar81 = occluded1(local_5e98,local_5ea0,root,k,&local_5fc1,ray,
                                 (TravRayK<8,_true> *)&local_5b40.field_0,context);
              if (bVar81) {
                *(undefined4 *)(local_5e40 + local_5fa0._0_8_ * 4) = 0xffffffff;
              }
              auVar171 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar173 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                            CONCAT424(0x3f7ffffa,
                                                      CONCAT420(0x3f7ffffa,
                                                                CONCAT416(0x3f7ffffa,
                                                                          CONCAT412(0x3f7ffffa,
                                                                                    CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              auVar143 = ZEXT3264(local_5f60);
              uVar77 = local_5fb8;
              ray = local_5fb0;
              context = local_5fa8;
            }
            auVar125 = _DAT_01fe9960 & ~local_5e40;
            iVar72 = 3;
            if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar125 >> 0x7f,0) != '\0') ||
                  (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar125 >> 0xbf,0) != '\0') ||
                (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar125[0x1f] < '\0') {
              auVar125._8_4_ = 0xff800000;
              auVar125._0_8_ = 0xff800000ff800000;
              auVar125._12_4_ = 0xff800000;
              auVar125._16_4_ = 0xff800000;
              auVar125._20_4_ = 0xff800000;
              auVar125._24_4_ = 0xff800000;
              auVar125._28_4_ = 0xff800000;
              auVar126 = ZEXT3264(auVar125);
              local_59a0 = vblendvps_avx(local_59a0,auVar125,local_5e40);
              iVar72 = 2;
            }
            unaff_R15 = 0;
            if ((uint)uVar77 < (uint)POPCOUNT(uVar80)) goto LAB_00607372;
          }
        } while (iVar72 != 3);
LAB_006086e3:
        auVar125 = vandps_avx(local_5980,local_5e40);
        auVar114._8_4_ = 0xff800000;
        auVar114._0_8_ = 0xff800000ff800000;
        auVar114._12_4_ = 0xff800000;
        auVar114._16_4_ = 0xff800000;
        auVar114._20_4_ = 0xff800000;
        auVar114._24_4_ = 0xff800000;
        auVar114._28_4_ = 0xff800000;
        auVar125 = vmaskmovps_avx(auVar125,auVar114);
        *(undefined1 (*) [32])local_5f68 = auVar125;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar73 = local_5e90 + 1;
    unaff_R15 = unaff_R15 + 0xe0;
    if ((ulong)auVar76 <= uVar73) break;
LAB_00607560:
    local_5e88 = uVar73 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    uVar79 = 0;
    local_5fc0 = unaff_R15;
    local_5e90 = uVar73;
    local_5e80 = auVar104;
    auVar125 = auVar104;
    while( true ) {
      uVar5 = *(uint *)(unaff_R15 + uVar79 * 4);
      if ((ulong)uVar5 == 0xffffffff) break;
      uVar80 = *(undefined4 *)((unaff_R15 - 0xc0) + uVar79 * 4);
      auVar83._4_4_ = uVar80;
      auVar83._0_4_ = uVar80;
      auVar83._8_4_ = uVar80;
      auVar83._12_4_ = uVar80;
      auVar83._16_4_ = uVar80;
      auVar83._20_4_ = uVar80;
      auVar83._24_4_ = uVar80;
      auVar83._28_4_ = uVar80;
      uVar80 = *(undefined4 *)((unaff_R15 - 0xb0) + uVar79 * 4);
      auVar118._4_4_ = uVar80;
      auVar118._0_4_ = uVar80;
      auVar118._8_4_ = uVar80;
      auVar118._12_4_ = uVar80;
      auVar118._16_4_ = uVar80;
      auVar118._20_4_ = uVar80;
      auVar118._24_4_ = uVar80;
      auVar118._28_4_ = uVar80;
      uVar80 = *(undefined4 *)((unaff_R15 - 0xa0) + uVar79 * 4);
      auVar172._4_4_ = uVar80;
      auVar172._0_4_ = uVar80;
      auVar172._8_4_ = uVar80;
      auVar172._12_4_ = uVar80;
      auVar172._16_4_ = uVar80;
      auVar172._20_4_ = uVar80;
      auVar172._24_4_ = uVar80;
      auVar172._28_4_ = uVar80;
      uVar2 = *(undefined4 *)((unaff_R15 - 0x90) + uVar79 * 4);
      local_5da0._4_4_ = uVar2;
      local_5da0._0_4_ = uVar2;
      local_5da0._8_4_ = uVar2;
      local_5da0._12_4_ = uVar2;
      local_5da0._16_4_ = uVar2;
      local_5da0._20_4_ = uVar2;
      local_5da0._24_4_ = uVar2;
      local_5da0._28_4_ = uVar2;
      local_5e60._4_4_ = *(undefined4 *)((unaff_R15 - 0x80) + uVar79 * 4);
      local_5e60._0_4_ = local_5e60._4_4_;
      local_5e60._8_4_ = local_5e60._4_4_;
      local_5e60._12_4_ = local_5e60._4_4_;
      local_5e60._16_4_ = local_5e60._4_4_;
      local_5e60._20_4_ = local_5e60._4_4_;
      local_5e60._24_4_ = local_5e60._4_4_;
      local_5e60._28_4_ = local_5e60._4_4_;
      uVar3 = *(undefined4 *)((unaff_R15 - 0x70) + uVar79 * 4);
      local_5dc0._4_4_ = uVar3;
      local_5dc0._0_4_ = uVar3;
      local_5dc0._8_4_ = uVar3;
      local_5dc0._12_4_ = uVar3;
      local_5dc0._16_4_ = uVar3;
      local_5dc0._20_4_ = uVar3;
      local_5dc0._24_4_ = uVar3;
      local_5dc0._28_4_ = uVar3;
      local_5de0._4_4_ = *(undefined4 *)((unaff_R15 - 0x60) + uVar79 * 4);
      local_5de0._0_4_ = local_5de0._4_4_;
      local_5de0._8_4_ = local_5de0._4_4_;
      local_5de0._12_4_ = local_5de0._4_4_;
      local_5de0._16_4_ = local_5de0._4_4_;
      local_5de0._20_4_ = local_5de0._4_4_;
      local_5de0._24_4_ = local_5de0._4_4_;
      local_5de0._28_4_ = local_5de0._4_4_;
      local_5e00._4_4_ = *(undefined4 *)((unaff_R15 - 0x50) + uVar79 * 4);
      local_5e00._0_4_ = local_5e00._4_4_;
      local_5e00._8_4_ = local_5e00._4_4_;
      local_5e00._12_4_ = local_5e00._4_4_;
      local_5e00._16_4_ = local_5e00._4_4_;
      local_5e00._20_4_ = local_5e00._4_4_;
      local_5e00._24_4_ = local_5e00._4_4_;
      local_5e00._28_4_ = local_5e00._4_4_;
      local_5840 = *(undefined4 *)((unaff_R15 - 0x40) + uVar79 * 4);
      uStack_583c = local_5840;
      uStack_5838 = local_5840;
      uStack_5834 = local_5840;
      uStack_5830 = local_5840;
      uStack_582c = local_5840;
      uStack_5828 = local_5840;
      uStack_5824 = local_5840;
      uVar3 = *(undefined4 *)((unaff_R15 - 0x30) + uVar79 * 4);
      local_5860._4_4_ = uVar3;
      local_5860._0_4_ = uVar3;
      local_5860._8_4_ = uVar3;
      local_5860._12_4_ = uVar3;
      local_5860._16_4_ = uVar3;
      local_5860._20_4_ = uVar3;
      local_5860._24_4_ = uVar3;
      local_5860._28_4_ = uVar3;
      uVar3 = *(undefined4 *)((unaff_R15 - 0x20) + uVar79 * 4);
      local_5880._4_4_ = uVar3;
      local_5880._0_4_ = uVar3;
      local_5880._8_4_ = uVar3;
      local_5880._12_4_ = uVar3;
      local_5880._16_4_ = uVar3;
      local_5880._20_4_ = uVar3;
      local_5880._24_4_ = uVar3;
      local_5880._28_4_ = uVar3;
      uVar3 = *(undefined4 *)((unaff_R15 - 0x10) + uVar79 * 4);
      local_58a0._4_4_ = uVar3;
      local_58a0._0_4_ = uVar3;
      local_58a0._8_4_ = uVar3;
      local_58a0._12_4_ = uVar3;
      local_58a0._16_4_ = uVar3;
      local_58a0._20_4_ = uVar3;
      local_58a0._24_4_ = uVar3;
      local_58a0._28_4_ = uVar3;
      local_5e10 = *(undefined8 *)(local_5e88 + 0xd0);
      uStack_5e08 = *(undefined8 *)(local_5e88 + 0xd8);
      auVar106 = *(undefined1 (*) [32])ray;
      auVar110 = *(undefined1 (*) [32])(ray + 0x20);
      auVar144 = *(undefined1 (*) [32])(ray + 0x40);
      local_5ca0 = vsubps_avx(auVar83,auVar106);
      local_5cc0 = vsubps_avx(auVar118,auVar110);
      local_5ce0 = vsubps_avx(auVar172,auVar144);
      auVar107 = vsubps_avx(local_5880,auVar110);
      auVar147 = vsubps_avx(local_58a0,auVar144);
      local_5d20 = vsubps_avx(auVar107,local_5cc0);
      local_5d00 = vsubps_avx(auVar147,local_5ce0);
      auVar165._0_4_ = auVar107._0_4_ + local_5cc0._0_4_;
      auVar165._4_4_ = auVar107._4_4_ + local_5cc0._4_4_;
      auVar165._8_4_ = auVar107._8_4_ + local_5cc0._8_4_;
      auVar165._12_4_ = auVar107._12_4_ + local_5cc0._12_4_;
      auVar165._16_4_ = auVar107._16_4_ + local_5cc0._16_4_;
      auVar165._20_4_ = auVar107._20_4_ + local_5cc0._20_4_;
      auVar165._24_4_ = auVar107._24_4_ + local_5cc0._24_4_;
      auVar165._28_4_ = auVar107._28_4_ + local_5cc0._28_4_;
      fVar82 = local_5ce0._0_4_;
      auVar169._0_4_ = auVar147._0_4_ + fVar82;
      fVar92 = local_5ce0._4_4_;
      auVar169._4_4_ = auVar147._4_4_ + fVar92;
      fVar94 = local_5ce0._8_4_;
      auVar169._8_4_ = auVar147._8_4_ + fVar94;
      fVar96 = local_5ce0._12_4_;
      auVar169._12_4_ = auVar147._12_4_ + fVar96;
      fVar9 = local_5ce0._16_4_;
      auVar169._16_4_ = auVar147._16_4_ + fVar9;
      fVar10 = local_5ce0._20_4_;
      auVar169._20_4_ = auVar147._20_4_ + fVar10;
      fVar11 = local_5ce0._24_4_;
      auVar169._24_4_ = auVar147._24_4_ + fVar11;
      fVar115 = local_5ce0._28_4_;
      auVar169._28_4_ = auVar147._28_4_ + fVar115;
      auVar23._4_4_ = auVar165._4_4_ * local_5d00._4_4_;
      auVar23._0_4_ = auVar165._0_4_ * local_5d00._0_4_;
      auVar23._8_4_ = auVar165._8_4_ * local_5d00._8_4_;
      auVar23._12_4_ = auVar165._12_4_ * local_5d00._12_4_;
      auVar23._16_4_ = auVar165._16_4_ * local_5d00._16_4_;
      auVar23._20_4_ = auVar165._20_4_ * local_5d00._20_4_;
      auVar23._24_4_ = auVar165._24_4_ * local_5d00._24_4_;
      auVar23._28_4_ = uVar80;
      auVar148 = vfmsub231ps_fma(auVar23,local_5d20,auVar169);
      auVar163 = vsubps_avx(local_5860,auVar106);
      local_5d40 = vsubps_avx(auVar163,local_5ca0);
      auVar24._4_4_ = auVar169._4_4_ * local_5d40._4_4_;
      auVar24._0_4_ = auVar169._0_4_ * local_5d40._0_4_;
      auVar24._8_4_ = auVar169._8_4_ * local_5d40._8_4_;
      auVar24._12_4_ = auVar169._12_4_ * local_5d40._12_4_;
      auVar24._16_4_ = auVar169._16_4_ * local_5d40._16_4_;
      auVar24._20_4_ = auVar169._20_4_ * local_5d40._20_4_;
      auVar24._24_4_ = auVar169._24_4_ * local_5d40._24_4_;
      auVar24._28_4_ = auVar169._28_4_;
      auVar175._0_4_ = auVar163._0_4_ + local_5ca0._0_4_;
      auVar175._4_4_ = auVar163._4_4_ + local_5ca0._4_4_;
      auVar175._8_4_ = auVar163._8_4_ + local_5ca0._8_4_;
      auVar175._12_4_ = auVar163._12_4_ + local_5ca0._12_4_;
      auVar175._16_4_ = auVar163._16_4_ + local_5ca0._16_4_;
      auVar175._20_4_ = auVar163._20_4_ + local_5ca0._20_4_;
      auVar175._24_4_ = auVar163._24_4_ + local_5ca0._24_4_;
      auVar175._28_4_ = auVar163._28_4_ + local_5ca0._28_4_;
      auVar97 = vfmsub231ps_fma(auVar24,local_5d00,auVar175);
      auVar25._4_4_ = auVar175._4_4_ * local_5d20._4_4_;
      auVar25._0_4_ = auVar175._0_4_ * local_5d20._0_4_;
      auVar25._8_4_ = auVar175._8_4_ * local_5d20._8_4_;
      auVar25._12_4_ = auVar175._12_4_ * local_5d20._12_4_;
      auVar25._16_4_ = auVar175._16_4_ * local_5d20._16_4_;
      auVar25._20_4_ = auVar175._20_4_ * local_5d20._20_4_;
      auVar25._24_4_ = auVar175._24_4_ * local_5d20._24_4_;
      auVar25._28_4_ = auVar175._28_4_;
      auVar16 = vfmsub231ps_fma(auVar25,local_5d40,auVar165);
      pRVar1 = ray + 0xc0;
      fVar127 = *(float *)pRVar1;
      fVar129 = *(float *)(ray + 0xc4);
      fVar131 = *(float *)(ray + 200);
      fVar133 = *(float *)(ray + 0xcc);
      fVar135 = *(float *)(ray + 0xd0);
      fVar137 = *(float *)(ray + 0xd4);
      fVar116 = *(float *)(ray + 0xd8);
      auVar71 = *(undefined1 (*) [28])pRVar1;
      auVar23 = *(undefined1 (*) [32])pRVar1;
      auVar26._4_4_ = auVar16._4_4_ * fVar129;
      auVar26._0_4_ = auVar16._0_4_ * fVar127;
      auVar26._8_4_ = auVar16._8_4_ * fVar131;
      auVar26._12_4_ = auVar16._12_4_ * fVar133;
      auVar26._16_4_ = fVar135 * 0.0;
      auVar26._20_4_ = fVar137 * 0.0;
      auVar26._24_4_ = fVar116 * 0.0;
      auVar26._28_4_ = local_5d40._28_4_;
      auVar111 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar97 = vfmadd231ps_fma(auVar26,auVar111,ZEXT1632(auVar97));
      local_5d60 = *(undefined1 (*) [32])(ray + 0x80);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),local_5d60,ZEXT1632(auVar148));
      auVar161 = ZEXT1664(auVar97);
      auVar106 = vsubps_avx(local_5da0,auVar106);
      auVar110 = vsubps_avx(local_5e60,auVar110);
      auVar144 = vsubps_avx(local_5dc0,auVar144);
      local_5d80 = vsubps_avx(local_5cc0,auVar110);
      auVar86 = vsubps_avx(local_5ce0,auVar144);
      auVar149._0_4_ = local_5cc0._0_4_ + auVar110._0_4_;
      auVar149._4_4_ = local_5cc0._4_4_ + auVar110._4_4_;
      auVar149._8_4_ = local_5cc0._8_4_ + auVar110._8_4_;
      auVar149._12_4_ = local_5cc0._12_4_ + auVar110._12_4_;
      auVar149._16_4_ = local_5cc0._16_4_ + auVar110._16_4_;
      auVar149._20_4_ = local_5cc0._20_4_ + auVar110._20_4_;
      auVar149._24_4_ = local_5cc0._24_4_ + auVar110._24_4_;
      auVar149._28_4_ = local_5cc0._28_4_ + auVar110._28_4_;
      auVar164._0_4_ = fVar82 + auVar144._0_4_;
      auVar164._4_4_ = fVar92 + auVar144._4_4_;
      auVar164._8_4_ = fVar94 + auVar144._8_4_;
      auVar164._12_4_ = fVar96 + auVar144._12_4_;
      auVar164._16_4_ = fVar9 + auVar144._16_4_;
      auVar164._20_4_ = fVar10 + auVar144._20_4_;
      auVar164._24_4_ = fVar11 + auVar144._24_4_;
      auVar164._28_4_ = fVar115 + auVar144._28_4_;
      fVar176 = auVar86._0_4_;
      fVar177 = auVar86._4_4_;
      auVar27._4_4_ = fVar177 * auVar149._4_4_;
      auVar27._0_4_ = fVar176 * auVar149._0_4_;
      fVar178 = auVar86._8_4_;
      auVar27._8_4_ = fVar178 * auVar149._8_4_;
      fVar179 = auVar86._12_4_;
      auVar27._12_4_ = fVar179 * auVar149._12_4_;
      fVar180 = auVar86._16_4_;
      auVar27._16_4_ = fVar180 * auVar149._16_4_;
      fVar181 = auVar86._20_4_;
      auVar27._20_4_ = fVar181 * auVar149._20_4_;
      fVar182 = auVar86._24_4_;
      auVar27._24_4_ = fVar182 * auVar149._24_4_;
      auVar27._28_4_ = uVar2;
      auVar16 = vfmsub231ps_fma(auVar27,local_5d80,auVar164);
      auVar160 = vsubps_avx(local_5ca0,auVar106);
      fVar91 = auVar160._0_4_;
      fVar93 = auVar160._4_4_;
      auVar28._4_4_ = auVar164._4_4_ * fVar93;
      auVar28._0_4_ = auVar164._0_4_ * fVar91;
      fVar95 = auVar160._8_4_;
      auVar28._8_4_ = auVar164._8_4_ * fVar95;
      fVar12 = auVar160._12_4_;
      auVar28._12_4_ = auVar164._12_4_ * fVar12;
      fVar13 = auVar160._16_4_;
      auVar28._16_4_ = auVar164._16_4_ * fVar13;
      fVar14 = auVar160._20_4_;
      auVar28._20_4_ = auVar164._20_4_ * fVar14;
      fVar15 = auVar160._24_4_;
      auVar28._24_4_ = auVar164._24_4_ * fVar15;
      auVar28._28_4_ = auVar164._28_4_;
      auVar153._0_4_ = local_5ca0._0_4_ + auVar106._0_4_;
      auVar153._4_4_ = local_5ca0._4_4_ + auVar106._4_4_;
      auVar153._8_4_ = local_5ca0._8_4_ + auVar106._8_4_;
      auVar153._12_4_ = local_5ca0._12_4_ + auVar106._12_4_;
      auVar153._16_4_ = local_5ca0._16_4_ + auVar106._16_4_;
      auVar153._20_4_ = local_5ca0._20_4_ + auVar106._20_4_;
      auVar153._24_4_ = local_5ca0._24_4_ + auVar106._24_4_;
      auVar153._28_4_ = local_5ca0._28_4_ + auVar106._28_4_;
      auVar148 = vfmsub231ps_fma(auVar28,auVar86,auVar153);
      fVar128 = local_5d80._0_4_;
      fVar130 = local_5d80._4_4_;
      auVar29._4_4_ = fVar130 * auVar153._4_4_;
      auVar29._0_4_ = fVar128 * auVar153._0_4_;
      fVar132 = local_5d80._8_4_;
      auVar29._8_4_ = fVar132 * auVar153._8_4_;
      fVar134 = local_5d80._12_4_;
      auVar29._12_4_ = fVar134 * auVar153._12_4_;
      fVar136 = local_5d80._16_4_;
      auVar29._16_4_ = fVar136 * auVar153._16_4_;
      fVar138 = local_5d80._20_4_;
      auVar29._20_4_ = fVar138 * auVar153._20_4_;
      fVar174 = local_5d80._24_4_;
      auVar29._24_4_ = fVar174 * auVar153._24_4_;
      auVar29._28_4_ = auVar153._28_4_;
      auVar17 = vfmsub231ps_fma(auVar29,auVar160,auVar149);
      auVar154._0_4_ = fVar127 * auVar17._0_4_;
      auVar154._4_4_ = fVar129 * auVar17._4_4_;
      auVar154._8_4_ = fVar131 * auVar17._8_4_;
      auVar154._12_4_ = fVar133 * auVar17._12_4_;
      auVar154._16_4_ = fVar135 * 0.0;
      auVar154._20_4_ = fVar137 * 0.0;
      auVar154._24_4_ = fVar116 * 0.0;
      auVar154._28_4_ = 0;
      auVar148 = vfmadd231ps_fma(auVar154,auVar111,ZEXT1632(auVar148));
      auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),local_5d60,ZEXT1632(auVar16));
      auVar90 = vsubps_avx(auVar106,auVar163);
      auVar84._0_4_ = auVar163._0_4_ + auVar106._0_4_;
      auVar84._4_4_ = auVar163._4_4_ + auVar106._4_4_;
      auVar84._8_4_ = auVar163._8_4_ + auVar106._8_4_;
      auVar84._12_4_ = auVar163._12_4_ + auVar106._12_4_;
      auVar84._16_4_ = auVar163._16_4_ + auVar106._16_4_;
      auVar84._20_4_ = auVar163._20_4_ + auVar106._20_4_;
      auVar84._24_4_ = auVar163._24_4_ + auVar106._24_4_;
      auVar84._28_4_ = auVar163._28_4_ + auVar106._28_4_;
      auVar163 = vsubps_avx(auVar110,auVar107);
      auVar152 = ZEXT3264(auVar163);
      auVar105._0_4_ = auVar110._0_4_ + auVar107._0_4_;
      auVar105._4_4_ = auVar110._4_4_ + auVar107._4_4_;
      auVar105._8_4_ = auVar110._8_4_ + auVar107._8_4_;
      auVar105._12_4_ = auVar110._12_4_ + auVar107._12_4_;
      auVar105._16_4_ = auVar110._16_4_ + auVar107._16_4_;
      auVar105._20_4_ = auVar110._20_4_ + auVar107._20_4_;
      auVar105._24_4_ = auVar110._24_4_ + auVar107._24_4_;
      auVar105._28_4_ = auVar110._28_4_ + auVar107._28_4_;
      auVar104 = vsubps_avx(auVar144,auVar147);
      auVar119._0_4_ = auVar144._0_4_ + auVar147._0_4_;
      auVar119._4_4_ = auVar144._4_4_ + auVar147._4_4_;
      auVar119._8_4_ = auVar144._8_4_ + auVar147._8_4_;
      auVar119._12_4_ = auVar144._12_4_ + auVar147._12_4_;
      auVar119._16_4_ = auVar144._16_4_ + auVar147._16_4_;
      auVar119._20_4_ = auVar144._20_4_ + auVar147._20_4_;
      auVar119._24_4_ = auVar144._24_4_ + auVar147._24_4_;
      auVar119._28_4_ = auVar144._28_4_ + auVar147._28_4_;
      auVar30._4_4_ = auVar104._4_4_ * auVar105._4_4_;
      auVar30._0_4_ = auVar104._0_4_ * auVar105._0_4_;
      auVar30._8_4_ = auVar104._8_4_ * auVar105._8_4_;
      auVar30._12_4_ = auVar104._12_4_ * auVar105._12_4_;
      auVar30._16_4_ = auVar104._16_4_ * auVar105._16_4_;
      auVar30._20_4_ = auVar104._20_4_ * auVar105._20_4_;
      auVar30._24_4_ = auVar104._24_4_ * auVar105._24_4_;
      auVar30._28_4_ = fVar115;
      auVar17 = vfmsub231ps_fma(auVar30,auVar163,auVar119);
      auVar31._4_4_ = auVar90._4_4_ * auVar119._4_4_;
      auVar31._0_4_ = auVar90._0_4_ * auVar119._0_4_;
      auVar31._8_4_ = auVar90._8_4_ * auVar119._8_4_;
      auVar31._12_4_ = auVar90._12_4_ * auVar119._12_4_;
      auVar31._16_4_ = auVar90._16_4_ * auVar119._16_4_;
      auVar31._20_4_ = auVar90._20_4_ * auVar119._20_4_;
      auVar31._24_4_ = auVar90._24_4_ * auVar119._24_4_;
      auVar31._28_4_ = auVar119._28_4_;
      auVar16 = vfmsub231ps_fma(auVar31,auVar104,auVar84);
      auVar32._4_4_ = auVar84._4_4_ * auVar163._4_4_;
      auVar32._0_4_ = auVar84._0_4_ * auVar163._0_4_;
      auVar32._8_4_ = auVar84._8_4_ * auVar163._8_4_;
      auVar32._12_4_ = auVar84._12_4_ * auVar163._12_4_;
      auVar32._16_4_ = auVar84._16_4_ * auVar163._16_4_;
      auVar32._20_4_ = auVar84._20_4_ * auVar163._20_4_;
      auVar32._24_4_ = auVar84._24_4_ * auVar163._24_4_;
      auVar32._28_4_ = auVar84._28_4_;
      auVar117 = vfmsub231ps_fma(auVar32,auVar90,auVar105);
      auVar85._0_4_ = fVar127 * auVar117._0_4_;
      auVar85._4_4_ = fVar129 * auVar117._4_4_;
      auVar85._8_4_ = fVar131 * auVar117._8_4_;
      auVar85._12_4_ = fVar133 * auVar117._12_4_;
      auVar85._16_4_ = fVar135 * 0.0;
      auVar85._20_4_ = fVar137 * 0.0;
      auVar85._24_4_ = fVar116 * 0.0;
      auVar85._28_4_ = 0;
      auVar16 = vfmadd231ps_fma(auVar85,auVar111,ZEXT1632(auVar16));
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_5d60,ZEXT1632(auVar17));
      local_5900 = ZEXT1632(CONCAT412(auVar16._12_4_ + auVar97._12_4_ + auVar148._12_4_,
                                      CONCAT48(auVar16._8_4_ + auVar97._8_4_ + auVar148._8_4_,
                                               CONCAT44(auVar16._4_4_ +
                                                        auVar97._4_4_ + auVar148._4_4_,
                                                        auVar16._0_4_ +
                                                        auVar97._0_4_ + auVar148._0_4_))));
      local_58c0 = ZEXT1632(auVar97);
      auVar106 = vminps_avx(local_58c0,ZEXT1632(auVar148));
      auVar106 = vminps_avx(auVar106,ZEXT1632(auVar16));
      local_5920 = vandps_avx(local_5900,local_5c80);
      fVar115 = local_5920._0_4_ * 1.1920929e-07;
      fVar127 = local_5920._4_4_ * 1.1920929e-07;
      auVar33._4_4_ = fVar127;
      auVar33._0_4_ = fVar115;
      fVar129 = local_5920._8_4_ * 1.1920929e-07;
      auVar33._8_4_ = fVar129;
      fVar131 = local_5920._12_4_ * 1.1920929e-07;
      auVar33._12_4_ = fVar131;
      fVar133 = local_5920._16_4_ * 1.1920929e-07;
      auVar33._16_4_ = fVar133;
      fVar135 = local_5920._20_4_ * 1.1920929e-07;
      auVar33._20_4_ = fVar135;
      fVar137 = local_5920._24_4_ * 1.1920929e-07;
      auVar33._24_4_ = fVar137;
      auVar33._28_4_ = 0x34000000;
      auVar126 = ZEXT3264(auVar33);
      local_5f60._8_4_ = 0x80000000;
      local_5f60._0_8_ = 0x8000000080000000;
      local_5f60._12_4_ = 0x80000000;
      local_5f60._16_4_ = 0x80000000;
      local_5f60._20_4_ = 0x80000000;
      local_5f60._24_4_ = 0x80000000;
      local_5f60._28_4_ = 0x80000000;
      auVar139._0_8_ = CONCAT44(fVar127,fVar115) ^ 0x8000000080000000;
      auVar139._8_4_ = -fVar129;
      auVar139._12_4_ = -fVar131;
      auVar139._16_4_ = -fVar133;
      auVar139._20_4_ = -fVar135;
      auVar139._24_4_ = -fVar137;
      auVar139._28_4_ = 0xb4000000;
      auVar106 = vcmpps_avx(auVar106,auVar139,5);
      local_58e0 = ZEXT1632(auVar148);
      auVar144 = vmaxps_avx(local_58c0,ZEXT1632(auVar148));
      auVar110 = vmaxps_avx(auVar144,ZEXT1632(auVar16));
      auVar110 = vcmpps_avx(auVar110,auVar33,2);
      auVar107 = vorps_avx(auVar106,auVar110);
      auVar147 = auVar125 & auVar107;
      local_5fa0._0_32_ = auVar125;
      _local_5f40 = auVar23;
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0x7f,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0xbf,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar147[0x1f]) {
        auVar171 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar173 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar167 = ZEXT3264(local_5f60);
      }
      else {
        auVar34._4_4_ = fVar130 * local_5d00._4_4_;
        auVar34._0_4_ = fVar128 * local_5d00._0_4_;
        auVar34._8_4_ = fVar132 * local_5d00._8_4_;
        auVar34._12_4_ = fVar134 * local_5d00._12_4_;
        auVar34._16_4_ = fVar136 * local_5d00._16_4_;
        auVar34._20_4_ = fVar138 * local_5d00._20_4_;
        auVar34._24_4_ = fVar174 * local_5d00._24_4_;
        auVar34._28_4_ = auVar110._28_4_;
        auVar35._4_4_ = fVar93 * local_5d20._4_4_;
        auVar35._0_4_ = fVar91 * local_5d20._0_4_;
        auVar35._8_4_ = fVar95 * local_5d20._8_4_;
        auVar35._12_4_ = fVar12 * local_5d20._12_4_;
        auVar35._16_4_ = fVar13 * local_5d20._16_4_;
        auVar35._20_4_ = fVar14 * local_5d20._20_4_;
        auVar35._24_4_ = fVar15 * local_5d20._24_4_;
        auVar35._28_4_ = auVar106._28_4_;
        auVar16 = vfmsub213ps_fma(local_5d20,auVar86,auVar34);
        auVar36._4_4_ = fVar177 * auVar163._4_4_;
        auVar36._0_4_ = fVar176 * auVar163._0_4_;
        auVar36._8_4_ = fVar178 * auVar163._8_4_;
        auVar36._12_4_ = fVar179 * auVar163._12_4_;
        auVar36._16_4_ = fVar180 * auVar163._16_4_;
        auVar36._20_4_ = fVar181 * auVar163._20_4_;
        auVar36._24_4_ = fVar182 * auVar163._24_4_;
        auVar36._28_4_ = 0x34000000;
        auVar37._4_4_ = fVar93 * auVar104._4_4_;
        auVar37._0_4_ = fVar91 * auVar104._0_4_;
        auVar37._8_4_ = fVar95 * auVar104._8_4_;
        auVar37._12_4_ = fVar12 * auVar104._12_4_;
        auVar37._16_4_ = fVar13 * auVar104._16_4_;
        auVar37._20_4_ = fVar14 * auVar104._20_4_;
        auVar37._24_4_ = fVar15 * auVar104._24_4_;
        auVar37._28_4_ = auVar144._28_4_;
        auVar17 = vfmsub213ps_fma(auVar104,local_5d80,auVar36);
        auVar106 = vandps_avx(auVar34,local_5c80);
        auVar110 = vandps_avx(auVar36,local_5c80);
        auVar106 = vcmpps_avx(auVar106,auVar110,1);
        auVar144 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar16),auVar106);
        auVar38._4_4_ = auVar90._4_4_ * fVar130;
        auVar38._0_4_ = auVar90._0_4_ * fVar128;
        auVar38._8_4_ = auVar90._8_4_ * fVar132;
        auVar38._12_4_ = auVar90._12_4_ * fVar134;
        auVar38._16_4_ = auVar90._16_4_ * fVar136;
        auVar38._20_4_ = auVar90._20_4_ * fVar138;
        auVar38._24_4_ = auVar90._24_4_ * fVar174;
        auVar38._28_4_ = auVar106._28_4_;
        auVar16 = vfmsub213ps_fma(auVar90,auVar86,auVar37);
        auVar39._4_4_ = fVar177 * local_5d40._4_4_;
        auVar39._0_4_ = fVar176 * local_5d40._0_4_;
        auVar39._8_4_ = fVar178 * local_5d40._8_4_;
        auVar39._12_4_ = fVar179 * local_5d40._12_4_;
        auVar39._16_4_ = fVar180 * local_5d40._16_4_;
        auVar39._20_4_ = fVar181 * local_5d40._20_4_;
        auVar39._24_4_ = fVar182 * local_5d40._24_4_;
        auVar39._28_4_ = auVar110._28_4_;
        auVar17 = vfmsub213ps_fma(local_5d00,auVar160,auVar39);
        auVar106 = vandps_avx(auVar39,local_5c80);
        auVar110 = vandps_avx(auVar37,local_5c80);
        auVar106 = vcmpps_avx(auVar106,auVar110,1);
        auVar147 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17),auVar106);
        auVar16 = vfmsub213ps_fma(local_5d40,local_5d80,auVar35);
        auVar17 = vfmsub213ps_fma(auVar163,auVar160,auVar38);
        auVar152 = ZEXT1664(auVar17);
        auVar106 = vandps_avx(local_5c80,auVar35);
        auVar110 = vandps_avx(local_5c80,auVar38);
        auVar110 = vcmpps_avx(auVar106,auVar110,1);
        auVar163 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar16),auVar110);
        auVar161 = ZEXT3264(auVar163);
        local_5f40._0_4_ = auVar71._0_4_;
        local_5f40._4_4_ = auVar71._4_4_;
        auStack_5f38._0_4_ = auVar71._8_4_;
        auStack_5f38._4_4_ = auVar71._12_4_;
        fStack_5f30 = auVar71._16_4_;
        fStack_5f2c = auVar71._20_4_;
        fStack_5f28 = auVar71._24_4_;
        auVar40._4_4_ = auVar163._4_4_ * (float)local_5f40._4_4_;
        auVar40._0_4_ = auVar163._0_4_ * (float)local_5f40._0_4_;
        auVar40._8_4_ = auVar163._8_4_ * (float)auStack_5f38._0_4_;
        auVar40._12_4_ = auVar163._12_4_ * (float)auStack_5f38._4_4_;
        auVar40._16_4_ = auVar163._16_4_ * fStack_5f30;
        auVar40._20_4_ = auVar163._20_4_ * fStack_5f2c;
        auVar40._24_4_ = auVar163._24_4_ * fStack_5f28;
        auVar40._28_4_ = auVar110._28_4_;
        auVar16 = vfmadd213ps_fma(auVar111,auVar147,auVar40);
        auVar16 = vfmadd213ps_fma(local_5d60,auVar144,ZEXT1632(auVar16));
        fVar115 = auVar16._0_4_ + auVar16._0_4_;
        fVar91 = auVar16._4_4_ + auVar16._4_4_;
        fVar93 = auVar16._8_4_ + auVar16._8_4_;
        fVar95 = auVar16._12_4_ + auVar16._12_4_;
        auVar86 = ZEXT1632(CONCAT412(fVar95,CONCAT48(fVar93,CONCAT44(fVar91,fVar115))));
        auVar41._4_4_ = auVar163._4_4_ * fVar92;
        auVar41._0_4_ = auVar163._0_4_ * fVar82;
        auVar41._8_4_ = auVar163._8_4_ * fVar94;
        auVar41._12_4_ = auVar163._12_4_ * fVar96;
        auVar41._16_4_ = auVar163._16_4_ * fVar9;
        auVar41._20_4_ = auVar163._20_4_ * fVar10;
        auVar41._24_4_ = auVar163._24_4_ * fVar11;
        auVar41._28_4_ = auVar106._28_4_;
        auVar16 = vfmadd213ps_fma(local_5cc0,auVar147,auVar41);
        auVar17 = vfmadd213ps_fma(local_5ca0,auVar144,ZEXT1632(auVar16));
        auVar106 = vrcpps_avx(auVar86);
        auVar145._8_4_ = 0x3f800000;
        auVar145._0_8_ = 0x3f8000003f800000;
        auVar145._12_4_ = 0x3f800000;
        auVar145._16_4_ = 0x3f800000;
        auVar145._20_4_ = 0x3f800000;
        auVar145._24_4_ = 0x3f800000;
        auVar145._28_4_ = 0x3f800000;
        auVar16 = vfnmadd213ps_fma(auVar106,auVar86,auVar145);
        auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar106,auVar106);
        auVar117._0_4_ = (auVar17._0_4_ + auVar17._0_4_) * auVar16._0_4_;
        auVar117._4_4_ = (auVar17._4_4_ + auVar17._4_4_) * auVar16._4_4_;
        auVar117._8_4_ = (auVar17._8_4_ + auVar17._8_4_) * auVar16._8_4_;
        auVar117._12_4_ = (auVar17._12_4_ + auVar17._12_4_) * auVar16._12_4_;
        auVar42._28_4_ = auVar106._28_4_;
        auVar42._0_28_ = ZEXT1628(auVar117);
        auVar126 = ZEXT3264(auVar42);
        local_5ee0 = *(undefined1 (*) [32])(ray + 0x100);
        auVar106 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar42,2);
        auVar110 = vcmpps_avx(auVar42,local_5ee0,2);
        auVar106 = vandps_avx(auVar106,auVar110);
        auVar167 = ZEXT3264(local_5f60);
        auVar140._0_8_ = CONCAT44(fVar91,fVar115) ^ 0x8000000080000000;
        auVar140._8_4_ = -fVar93;
        auVar140._12_4_ = -fVar95;
        auVar140._16_4_ = 0x80000000;
        auVar140._20_4_ = 0x80000000;
        auVar140._24_4_ = 0x80000000;
        auVar140._28_4_ = 0x80000000;
        auVar110 = vcmpps_avx(auVar86,auVar140,4);
        auVar106 = vandps_avx(auVar110,auVar106);
        auVar110 = vandps_avx(auVar107,auVar125);
        auVar106 = vpslld_avx2(auVar106,0x1f);
        auVar107 = vpsrad_avx2(auVar106,0x1f);
        auVar106 = auVar110 & auVar107;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          auVar171 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar173 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
        }
        else {
          auVar106 = vandps_avx(auVar107,auVar110);
          pGVar6 = (context->scene->geometries).items[uVar5].ptr;
          uVar4 = pGVar6->mask;
          auVar108._4_4_ = uVar4;
          auVar108._0_4_ = uVar4;
          auVar108._8_4_ = uVar4;
          auVar108._12_4_ = uVar4;
          auVar108._16_4_ = uVar4;
          auVar108._20_4_ = uVar4;
          auVar108._24_4_ = uVar4;
          auVar108._28_4_ = uVar4;
          auVar110 = vpand_avx2(auVar108,*(undefined1 (*) [32])(ray + 0x120));
          auVar107 = vpcmpeqd_avx2(auVar110,_DAT_01faff00);
          auVar110 = auVar106 & ~auVar107;
          auVar171 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar173 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          unaff_R15 = local_5fc0;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            uVar80 = *(undefined4 *)((long)&local_5e10 + uVar79 * 4);
            auVar125 = vandnps_avx(auVar107,auVar106);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar106 = vrcpps_avx(local_5900);
              auVar150._8_4_ = 0x3f800000;
              auVar150._0_8_ = 0x3f8000003f800000;
              auVar150._12_4_ = 0x3f800000;
              auVar150._16_4_ = 0x3f800000;
              auVar150._20_4_ = 0x3f800000;
              auVar150._24_4_ = 0x3f800000;
              auVar150._28_4_ = 0x3f800000;
              auVar16 = vfnmadd213ps_fma(local_5900,auVar106,auVar150);
              auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar106,auVar106);
              auVar88._8_4_ = 0x219392ef;
              auVar88._0_8_ = 0x219392ef219392ef;
              auVar88._12_4_ = 0x219392ef;
              auVar88._16_4_ = 0x219392ef;
              auVar88._20_4_ = 0x219392ef;
              auVar88._24_4_ = 0x219392ef;
              auVar88._28_4_ = 0x219392ef;
              auVar106 = vcmpps_avx(local_5920,auVar88,5);
              auVar106 = vandps_avx(auVar106,ZEXT1632(auVar16));
              auVar61._4_4_ = auVar106._4_4_ * auVar97._4_4_;
              auVar61._0_4_ = auVar106._0_4_ * auVar97._0_4_;
              auVar61._8_4_ = auVar106._8_4_ * auVar97._8_4_;
              auVar61._12_4_ = auVar106._12_4_ * auVar97._12_4_;
              auVar61._16_4_ = auVar106._16_4_ * 0.0;
              auVar61._20_4_ = auVar106._20_4_ * 0.0;
              auVar61._24_4_ = auVar106._24_4_ * 0.0;
              auVar61._28_4_ = local_5920._28_4_;
              auVar110 = vminps_avx(auVar61,auVar150);
              auVar62._4_4_ = auVar106._4_4_ * auVar148._4_4_;
              auVar62._0_4_ = auVar106._0_4_ * auVar148._0_4_;
              auVar62._8_4_ = auVar106._8_4_ * auVar148._8_4_;
              auVar62._12_4_ = auVar106._12_4_ * auVar148._12_4_;
              auVar62._16_4_ = auVar106._16_4_ * 0.0;
              auVar62._20_4_ = auVar106._20_4_ * 0.0;
              auVar62._24_4_ = auVar106._24_4_ * 0.0;
              auVar62._28_4_ = auVar106._28_4_;
              auVar106 = vminps_avx(auVar62,auVar150);
              auVar107 = vsubps_avx(auVar150,auVar110);
              auVar86 = vsubps_avx(auVar150,auVar106);
              auVar69._8_8_ = uStack_5938;
              auVar69._0_8_ = local_5940;
              auVar69._16_8_ = uStack_5930;
              auVar69._24_8_ = uStack_5928;
              local_5c00 = vblendvps_avx(auVar110,auVar107,auVar69);
              local_5be0 = vblendvps_avx(auVar106,auVar86,auVar69);
              pRVar7 = context->user;
              auVar97._4_4_ = uVar80;
              auVar97._0_4_ = uVar80;
              auVar97._8_4_ = uVar80;
              auVar97._12_4_ = uVar80;
              local_5bc0._16_4_ = uVar80;
              local_5bc0._0_16_ = auVar97;
              local_5bc0._20_4_ = uVar80;
              local_5bc0._24_4_ = uVar80;
              local_5bc0._28_4_ = uVar80;
              auVar152 = ZEXT3264(local_5bc0);
              local_5c60[0] = (RTCHitN)auVar144[0];
              local_5c60[1] = (RTCHitN)auVar144[1];
              local_5c60[2] = (RTCHitN)auVar144[2];
              local_5c60[3] = (RTCHitN)auVar144[3];
              local_5c60[4] = (RTCHitN)auVar144[4];
              local_5c60[5] = (RTCHitN)auVar144[5];
              local_5c60[6] = (RTCHitN)auVar144[6];
              local_5c60[7] = (RTCHitN)auVar144[7];
              local_5c60[8] = (RTCHitN)auVar144[8];
              local_5c60[9] = (RTCHitN)auVar144[9];
              local_5c60[10] = (RTCHitN)auVar144[10];
              local_5c60[0xb] = (RTCHitN)auVar144[0xb];
              local_5c60[0xc] = (RTCHitN)auVar144[0xc];
              local_5c60[0xd] = (RTCHitN)auVar144[0xd];
              local_5c60[0xe] = (RTCHitN)auVar144[0xe];
              local_5c60[0xf] = (RTCHitN)auVar144[0xf];
              local_5c60[0x10] = (RTCHitN)auVar144[0x10];
              local_5c60[0x11] = (RTCHitN)auVar144[0x11];
              local_5c60[0x12] = (RTCHitN)auVar144[0x12];
              local_5c60[0x13] = (RTCHitN)auVar144[0x13];
              local_5c60[0x14] = (RTCHitN)auVar144[0x14];
              local_5c60[0x15] = (RTCHitN)auVar144[0x15];
              local_5c60[0x16] = (RTCHitN)auVar144[0x16];
              local_5c60[0x17] = (RTCHitN)auVar144[0x17];
              local_5c60[0x18] = (RTCHitN)auVar144[0x18];
              local_5c60[0x19] = (RTCHitN)auVar144[0x19];
              local_5c60[0x1a] = (RTCHitN)auVar144[0x1a];
              local_5c60[0x1b] = (RTCHitN)auVar144[0x1b];
              local_5c60[0x1c] = (RTCHitN)auVar144[0x1c];
              local_5c60[0x1d] = (RTCHitN)auVar144[0x1d];
              local_5c60[0x1e] = (RTCHitN)auVar144[0x1e];
              local_5c60[0x1f] = (RTCHitN)auVar144[0x1f];
              local_5c40 = auVar147;
              local_5c20 = auVar163;
              local_5ba0 = uVar5;
              uStack_5b9c = uVar5;
              uStack_5b98 = uVar5;
              uStack_5b94 = uVar5;
              uStack_5b90 = uVar5;
              uStack_5b8c = uVar5;
              uStack_5b88 = uVar5;
              uStack_5b84 = uVar5;
              auVar110 = vpcmpeqd_avx2(local_5c00,local_5c00);
              local_5f18[1] = auVar110;
              *local_5f18 = auVar110;
              local_5b80 = pRVar7->instID[0];
              uStack_5b7c = local_5b80;
              uStack_5b78 = local_5b80;
              uStack_5b74 = local_5b80;
              uStack_5b70 = local_5b80;
              uStack_5b6c = local_5b80;
              uStack_5b68 = local_5b80;
              uStack_5b64 = local_5b80;
              local_5b60 = pRVar7->instPrimID[0];
              uStack_5b5c = local_5b60;
              uStack_5b58 = local_5b60;
              uStack_5b54 = local_5b60;
              uStack_5b50 = local_5b60;
              uStack_5b4c = local_5b60;
              uStack_5b48 = local_5b60;
              uStack_5b44 = local_5b60;
              auVar106 = vblendvps_avx(local_5ee0,auVar42,auVar125);
              *(undefined1 (*) [32])(ray + 0x100) = auVar106;
              local_5f10.valid = (int *)local_5ec0;
              local_5f10.geometryUserPtr = pGVar6->userPtr;
              local_5f10.context = context->user;
              local_5f10.hit = local_5c60;
              local_5f10.N = 8;
              auVar106 = local_5ee0;
              local_5f10.ray = (RTCRayN *)ray;
              local_5ec0 = auVar125;
              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                _auStack_5f38 = auVar23._8_24_;
                local_5f40 = auVar76;
                auVar126 = ZEXT1664(auVar117);
                auVar125 = ZEXT1632(auVar110._0_16_);
                auVar152 = ZEXT1664(auVar97);
                auVar161 = ZEXT1664(auVar163._0_16_);
                (*pGVar6->occlusionFilterN)(&local_5f10);
                auVar167 = ZEXT3264(local_5f60);
                auVar110 = vpcmpeqd_avx2(auVar125,auVar125);
                auVar173 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar171 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar76 = local_5f40;
                uVar77 = local_5fb8;
                ray = local_5fb0;
                context = local_5fa8;
                auVar106 = local_5ee0;
                auVar111 = local_5ee0;
              }
              local_5ee0 = auVar111;
              auVar125 = vpcmpeqd_avx2(local_5ec0,_DAT_01faff00);
              auVar144 = auVar110 & ~auVar125;
              if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar144 >> 0x7f,0) == '\0') &&
                    (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar144 >> 0xbf,0) == '\0') &&
                  (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar144[0x1f]) {
                auVar125 = auVar125 ^ auVar110;
              }
              else {
                p_Var8 = context->args->filter;
                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar152 = ZEXT1664(auVar152._0_16_);
                  auVar161 = ZEXT1664(auVar161._0_16_);
                  local_5ee0 = auVar106;
                  (*p_Var8)(&local_5f10);
                  auVar167 = ZEXT3264(local_5f60);
                  auVar173 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar171 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  uVar77 = local_5fb8;
                  ray = local_5fb0;
                  context = local_5fa8;
                  auVar106 = local_5ee0;
                }
                auVar110 = vpcmpeqd_avx2(local_5ec0,_DAT_01faff00);
                auVar125 = auVar110 ^ _DAT_01fe9960;
                auVar123._8_4_ = 0xff800000;
                auVar123._0_8_ = 0xff800000ff800000;
                auVar123._12_4_ = 0xff800000;
                auVar123._16_4_ = 0xff800000;
                auVar123._20_4_ = 0xff800000;
                auVar123._24_4_ = 0xff800000;
                auVar123._28_4_ = 0xff800000;
                auVar126 = ZEXT3264(auVar123);
                auVar110 = vblendvps_avx(auVar123,*(undefined1 (*) [32])(local_5f10.ray + 0x100),
                                         auVar110);
                *(undefined1 (*) [32])(local_5f10.ray + 0x100) = auVar110;
              }
              auVar106 = vblendvps_avx(auVar106,*(undefined1 (*) [32])local_5f68,auVar125);
              *(undefined1 (*) [32])local_5f68 = auVar106;
              auVar111 = local_5ee0;
            }
            local_5ee0 = auVar111;
            auVar125 = vandnps_avx(auVar125,local_5fa0._0_32_);
            unaff_R15 = local_5fc0;
            auVar111 = local_5ee0;
          }
        }
      }
      local_5ee0 = auVar111;
      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar125 >> 0x7f,0) == '\0') &&
            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar125 >> 0xbf,0) == '\0') &&
          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar125[0x1f]) break;
      auVar106 = *(undefined1 (*) [32])ray;
      auVar110 = *(undefined1 (*) [32])(ray + 0x20);
      auVar144 = *(undefined1 (*) [32])(ray + 0x40);
      local_5cc0 = vsubps_avx(local_5de0,auVar106);
      local_5ce0 = vsubps_avx(local_5e00,auVar110);
      auVar70._4_4_ = uStack_583c;
      auVar70._0_4_ = local_5840;
      auVar70._8_4_ = uStack_5838;
      auVar70._12_4_ = uStack_5834;
      auVar70._16_4_ = uStack_5830;
      auVar70._20_4_ = uStack_582c;
      auVar70._24_4_ = uStack_5828;
      auVar70._28_4_ = uStack_5824;
      local_5d00 = vsubps_avx(auVar70,auVar144);
      auVar111 = vsubps_avx(local_5860,auVar106);
      auVar107 = vsubps_avx(local_5880,auVar110);
      auVar147 = vsubps_avx(local_58a0,auVar144);
      auVar106 = vsubps_avx(local_5da0,auVar106);
      auVar110 = vsubps_avx(local_5e60,auVar110);
      auVar144 = vsubps_avx(local_5dc0,auVar144);
      local_5d20 = vsubps_avx(auVar106,local_5cc0);
      local_5d60 = vsubps_avx(auVar110,local_5ce0);
      local_5d40 = vsubps_avx(auVar144,local_5d00);
      auVar158._0_4_ = auVar106._0_4_ + local_5cc0._0_4_;
      auVar158._4_4_ = auVar106._4_4_ + local_5cc0._4_4_;
      auVar158._8_4_ = auVar106._8_4_ + local_5cc0._8_4_;
      auVar158._12_4_ = auVar106._12_4_ + local_5cc0._12_4_;
      auVar158._16_4_ = auVar106._16_4_ + local_5cc0._16_4_;
      auVar158._20_4_ = auVar106._20_4_ + local_5cc0._20_4_;
      auVar158._24_4_ = auVar106._24_4_ + local_5cc0._24_4_;
      auVar158._28_4_ = auVar106._28_4_ + local_5cc0._28_4_;
      auVar166._0_4_ = local_5ce0._0_4_ + auVar110._0_4_;
      auVar166._4_4_ = local_5ce0._4_4_ + auVar110._4_4_;
      auVar166._8_4_ = local_5ce0._8_4_ + auVar110._8_4_;
      auVar166._12_4_ = local_5ce0._12_4_ + auVar110._12_4_;
      auVar166._16_4_ = local_5ce0._16_4_ + auVar110._16_4_;
      auVar166._20_4_ = local_5ce0._20_4_ + auVar110._20_4_;
      auVar166._24_4_ = local_5ce0._24_4_ + auVar110._24_4_;
      auVar166._28_4_ = local_5ce0._28_4_ + auVar110._28_4_;
      fVar182 = local_5d00._0_4_;
      auVar170._0_4_ = fVar182 + auVar144._0_4_;
      fVar183 = local_5d00._4_4_;
      auVar170._4_4_ = fVar183 + auVar144._4_4_;
      fVar184 = local_5d00._8_4_;
      auVar170._8_4_ = fVar184 + auVar144._8_4_;
      fVar185 = local_5d00._12_4_;
      auVar170._12_4_ = fVar185 + auVar144._12_4_;
      fVar186 = local_5d00._16_4_;
      auVar170._16_4_ = fVar186 + auVar144._16_4_;
      fVar187 = local_5d00._20_4_;
      auVar170._20_4_ = fVar187 + auVar144._20_4_;
      fVar188 = local_5d00._24_4_;
      auVar170._24_4_ = fVar188 + auVar144._24_4_;
      auVar170._28_4_ = local_5d00._28_4_ + auVar144._28_4_;
      auVar126._0_4_ = auVar166._0_4_ * local_5d40._0_4_;
      auVar126._4_4_ = auVar166._4_4_ * local_5d40._4_4_;
      auVar126._8_4_ = auVar166._8_4_ * local_5d40._8_4_;
      auVar126._12_4_ = auVar166._12_4_ * local_5d40._12_4_;
      auVar126._16_4_ = auVar166._16_4_ * local_5d40._16_4_;
      auVar126._20_4_ = auVar166._20_4_ * local_5d40._20_4_;
      auVar126._28_36_ = auVar173._28_36_;
      auVar126._24_4_ = auVar166._24_4_ * local_5d40._24_4_;
      auVar148 = vfmsub231ps_fma(auVar126._0_32_,local_5d60,auVar170);
      auVar43._4_4_ = auVar170._4_4_ * local_5d20._4_4_;
      auVar43._0_4_ = auVar170._0_4_ * local_5d20._0_4_;
      auVar43._8_4_ = auVar170._8_4_ * local_5d20._8_4_;
      auVar43._12_4_ = auVar170._12_4_ * local_5d20._12_4_;
      auVar43._16_4_ = auVar170._16_4_ * local_5d20._16_4_;
      auVar43._20_4_ = auVar170._20_4_ * local_5d20._20_4_;
      auVar43._24_4_ = auVar170._24_4_ * local_5d20._24_4_;
      auVar43._28_4_ = auVar170._28_4_;
      auVar97 = vfmsub231ps_fma(auVar43,local_5d40,auVar158);
      auVar44._4_4_ = auVar158._4_4_ * local_5d60._4_4_;
      auVar44._0_4_ = auVar158._0_4_ * local_5d60._0_4_;
      auVar44._8_4_ = auVar158._8_4_ * local_5d60._8_4_;
      auVar44._12_4_ = auVar158._12_4_ * local_5d60._12_4_;
      auVar44._16_4_ = auVar158._16_4_ * local_5d60._16_4_;
      auVar44._20_4_ = auVar158._20_4_ * local_5d60._20_4_;
      auVar44._24_4_ = auVar158._24_4_ * local_5d60._24_4_;
      auVar44._28_4_ = auVar158._28_4_;
      auVar16 = vfmsub231ps_fma(auVar44,local_5d20,auVar166);
      local_5e60 = *(undefined1 (*) [32])(ray + 0xc0);
      fVar82 = local_5e60._0_4_;
      fVar96 = local_5e60._4_4_;
      auVar45._4_4_ = auVar16._4_4_ * fVar96;
      auVar45._0_4_ = auVar16._0_4_ * fVar82;
      fVar11 = local_5e60._8_4_;
      auVar45._8_4_ = auVar16._8_4_ * fVar11;
      fVar93 = local_5e60._12_4_;
      auVar45._12_4_ = auVar16._12_4_ * fVar93;
      fVar13 = local_5e60._16_4_;
      auVar45._16_4_ = fVar13 * 0.0;
      fVar127 = local_5e60._20_4_;
      auVar45._20_4_ = fVar127 * 0.0;
      fVar133 = local_5e60._24_4_;
      auVar45._24_4_ = fVar133 * 0.0;
      auVar45._28_4_ = local_5d60._28_4_;
      local_5ca0 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar97 = vfmadd231ps_fma(auVar45,local_5ca0,ZEXT1632(auVar97));
      _local_5f40 = *(undefined1 (*) [32])(ray + 0x80);
      auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),_local_5f40,ZEXT1632(auVar148));
      local_5d80 = vsubps_avx(local_5ce0,auVar107);
      local_5da0 = vsubps_avx(local_5d00,auVar147);
      auVar159._0_4_ = local_5ce0._0_4_ + auVar107._0_4_;
      auVar159._4_4_ = local_5ce0._4_4_ + auVar107._4_4_;
      auVar159._8_4_ = local_5ce0._8_4_ + auVar107._8_4_;
      auVar159._12_4_ = local_5ce0._12_4_ + auVar107._12_4_;
      auVar159._16_4_ = local_5ce0._16_4_ + auVar107._16_4_;
      auVar159._20_4_ = local_5ce0._20_4_ + auVar107._20_4_;
      auVar159._24_4_ = local_5ce0._24_4_ + auVar107._24_4_;
      auVar159._28_4_ = local_5ce0._28_4_ + auVar107._28_4_;
      auVar120._0_4_ = fVar182 + auVar147._0_4_;
      auVar120._4_4_ = fVar183 + auVar147._4_4_;
      auVar120._8_4_ = fVar184 + auVar147._8_4_;
      auVar120._12_4_ = fVar185 + auVar147._12_4_;
      auVar120._16_4_ = fVar186 + auVar147._16_4_;
      auVar120._20_4_ = fVar187 + auVar147._20_4_;
      auVar120._24_4_ = fVar188 + auVar147._24_4_;
      auVar120._28_4_ = local_5d00._28_4_ + auVar147._28_4_;
      fVar92 = local_5da0._0_4_;
      fVar9 = local_5da0._4_4_;
      auVar46._4_4_ = auVar159._4_4_ * fVar9;
      auVar46._0_4_ = auVar159._0_4_ * fVar92;
      fVar115 = local_5da0._8_4_;
      auVar46._8_4_ = auVar159._8_4_ * fVar115;
      fVar95 = local_5da0._12_4_;
      auVar46._12_4_ = auVar159._12_4_ * fVar95;
      fVar14 = local_5da0._16_4_;
      auVar46._16_4_ = auVar159._16_4_ * fVar14;
      fVar129 = local_5da0._20_4_;
      auVar46._20_4_ = auVar159._20_4_ * fVar129;
      fVar135 = local_5da0._24_4_;
      auVar46._24_4_ = auVar159._24_4_ * fVar135;
      auVar46._28_4_ = auVar167._28_4_;
      auVar16 = vfmsub231ps_fma(auVar46,local_5d80,auVar120);
      auVar163 = vsubps_avx(local_5cc0,auVar111);
      fVar174 = auVar163._0_4_;
      fVar176 = auVar163._4_4_;
      auVar47._4_4_ = fVar176 * auVar120._4_4_;
      auVar47._0_4_ = fVar174 * auVar120._0_4_;
      fVar177 = auVar163._8_4_;
      auVar47._8_4_ = fVar177 * auVar120._8_4_;
      fVar178 = auVar163._12_4_;
      auVar47._12_4_ = fVar178 * auVar120._12_4_;
      fVar179 = auVar163._16_4_;
      auVar47._16_4_ = fVar179 * auVar120._16_4_;
      fVar180 = auVar163._20_4_;
      auVar47._20_4_ = fVar180 * auVar120._20_4_;
      fVar181 = auVar163._24_4_;
      auVar47._24_4_ = fVar181 * auVar120._24_4_;
      auVar47._28_4_ = auVar120._28_4_;
      auVar155._0_4_ = local_5cc0._0_4_ + auVar111._0_4_;
      auVar155._4_4_ = local_5cc0._4_4_ + auVar111._4_4_;
      auVar155._8_4_ = local_5cc0._8_4_ + auVar111._8_4_;
      auVar155._12_4_ = local_5cc0._12_4_ + auVar111._12_4_;
      auVar155._16_4_ = local_5cc0._16_4_ + auVar111._16_4_;
      auVar155._20_4_ = local_5cc0._20_4_ + auVar111._20_4_;
      auVar155._24_4_ = local_5cc0._24_4_ + auVar111._24_4_;
      auVar155._28_4_ = local_5cc0._28_4_ + auVar111._28_4_;
      auVar148 = vfmsub231ps_fma(auVar47,local_5da0,auVar155);
      fVar94 = local_5d80._0_4_;
      fVar10 = local_5d80._4_4_;
      auVar48._4_4_ = auVar155._4_4_ * fVar10;
      auVar48._0_4_ = auVar155._0_4_ * fVar94;
      fVar91 = local_5d80._8_4_;
      auVar48._8_4_ = auVar155._8_4_ * fVar91;
      fVar12 = local_5d80._12_4_;
      auVar48._12_4_ = auVar155._12_4_ * fVar12;
      fVar15 = local_5d80._16_4_;
      auVar48._16_4_ = auVar155._16_4_ * fVar15;
      fVar131 = local_5d80._20_4_;
      auVar48._20_4_ = auVar155._20_4_ * fVar131;
      fVar137 = local_5d80._24_4_;
      auVar48._24_4_ = auVar155._24_4_ * fVar137;
      auVar48._28_4_ = auVar155._28_4_;
      auVar17 = vfmsub231ps_fma(auVar48,auVar163,auVar159);
      auVar156._0_4_ = fVar82 * auVar17._0_4_;
      auVar156._4_4_ = fVar96 * auVar17._4_4_;
      auVar156._8_4_ = fVar11 * auVar17._8_4_;
      auVar156._12_4_ = fVar93 * auVar17._12_4_;
      auVar156._16_4_ = fVar13 * 0.0;
      auVar156._20_4_ = fVar127 * 0.0;
      auVar156._24_4_ = fVar133 * 0.0;
      auVar156._28_4_ = 0;
      auVar148 = vfmadd231ps_fma(auVar156,local_5ca0,ZEXT1632(auVar148));
      auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),_local_5f40,ZEXT1632(auVar16));
      auVar86 = vsubps_avx(auVar111,auVar106);
      auVar161 = ZEXT3264(auVar86);
      auVar121._0_4_ = auVar111._0_4_ + auVar106._0_4_;
      auVar121._4_4_ = auVar111._4_4_ + auVar106._4_4_;
      auVar121._8_4_ = auVar111._8_4_ + auVar106._8_4_;
      auVar121._12_4_ = auVar111._12_4_ + auVar106._12_4_;
      auVar121._16_4_ = auVar111._16_4_ + auVar106._16_4_;
      auVar121._20_4_ = auVar111._20_4_ + auVar106._20_4_;
      auVar121._24_4_ = auVar111._24_4_ + auVar106._24_4_;
      auVar121._28_4_ = auVar111._28_4_ + auVar106._28_4_;
      auVar160 = vsubps_avx(auVar107,auVar110);
      auVar152 = ZEXT3264(auVar160);
      auVar109._0_4_ = auVar107._0_4_ + auVar110._0_4_;
      auVar109._4_4_ = auVar107._4_4_ + auVar110._4_4_;
      auVar109._8_4_ = auVar107._8_4_ + auVar110._8_4_;
      auVar109._12_4_ = auVar107._12_4_ + auVar110._12_4_;
      auVar109._16_4_ = auVar107._16_4_ + auVar110._16_4_;
      auVar109._20_4_ = auVar107._20_4_ + auVar110._20_4_;
      auVar109._24_4_ = auVar107._24_4_ + auVar110._24_4_;
      auVar109._28_4_ = auVar107._28_4_ + auVar110._28_4_;
      auVar107 = vsubps_avx(auVar147,auVar144);
      auVar87._0_4_ = auVar147._0_4_ + auVar144._0_4_;
      auVar87._4_4_ = auVar147._4_4_ + auVar144._4_4_;
      auVar87._8_4_ = auVar147._8_4_ + auVar144._8_4_;
      auVar87._12_4_ = auVar147._12_4_ + auVar144._12_4_;
      auVar87._16_4_ = auVar147._16_4_ + auVar144._16_4_;
      auVar87._20_4_ = auVar147._20_4_ + auVar144._20_4_;
      auVar87._24_4_ = auVar147._24_4_ + auVar144._24_4_;
      auVar87._28_4_ = auVar147._28_4_ + auVar144._28_4_;
      auVar141._0_4_ = auVar107._0_4_ * auVar109._0_4_;
      auVar141._4_4_ = auVar107._4_4_ * auVar109._4_4_;
      auVar141._8_4_ = auVar107._8_4_ * auVar109._8_4_;
      auVar141._12_4_ = auVar107._12_4_ * auVar109._12_4_;
      auVar141._16_4_ = auVar107._16_4_ * auVar109._16_4_;
      auVar141._20_4_ = auVar107._20_4_ * auVar109._20_4_;
      auVar141._24_4_ = auVar107._24_4_ * auVar109._24_4_;
      auVar141._28_4_ = 0;
      auVar17 = vfmsub231ps_fma(auVar141,auVar160,auVar87);
      auVar49._4_4_ = auVar86._4_4_ * auVar87._4_4_;
      auVar49._0_4_ = auVar86._0_4_ * auVar87._0_4_;
      auVar49._8_4_ = auVar86._8_4_ * auVar87._8_4_;
      auVar49._12_4_ = auVar86._12_4_ * auVar87._12_4_;
      auVar49._16_4_ = auVar86._16_4_ * auVar87._16_4_;
      auVar49._20_4_ = auVar86._20_4_ * auVar87._20_4_;
      auVar49._24_4_ = auVar86._24_4_ * auVar87._24_4_;
      auVar49._28_4_ = auVar87._28_4_;
      auVar16 = vfmsub231ps_fma(auVar49,auVar107,auVar121);
      auVar50._4_4_ = auVar121._4_4_ * auVar160._4_4_;
      auVar50._0_4_ = auVar121._0_4_ * auVar160._0_4_;
      auVar50._8_4_ = auVar121._8_4_ * auVar160._8_4_;
      auVar50._12_4_ = auVar121._12_4_ * auVar160._12_4_;
      auVar50._16_4_ = auVar121._16_4_ * auVar160._16_4_;
      auVar50._20_4_ = auVar121._20_4_ * auVar160._20_4_;
      auVar50._24_4_ = auVar121._24_4_ * auVar160._24_4_;
      auVar50._28_4_ = auVar121._28_4_;
      auVar117 = vfmsub231ps_fma(auVar50,auVar86,auVar109);
      auVar51._4_4_ = fVar96 * auVar117._4_4_;
      auVar51._0_4_ = fVar82 * auVar117._0_4_;
      auVar51._8_4_ = fVar11 * auVar117._8_4_;
      auVar51._12_4_ = fVar93 * auVar117._12_4_;
      auVar51._16_4_ = fVar13 * 0.0;
      auVar51._20_4_ = fVar127 * 0.0;
      auVar51._24_4_ = fVar133 * 0.0;
      auVar51._28_4_ = auVar109._28_4_;
      auVar16 = vfmadd231ps_fma(auVar51,local_5ca0,ZEXT1632(auVar16));
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),_local_5f40,ZEXT1632(auVar17));
      local_5dc0 = ZEXT1632(CONCAT412(auVar16._12_4_ + auVar97._12_4_ + auVar148._12_4_,
                                      CONCAT48(auVar16._8_4_ + auVar97._8_4_ + auVar148._8_4_,
                                               CONCAT44(auVar16._4_4_ +
                                                        auVar97._4_4_ + auVar148._4_4_,
                                                        auVar16._0_4_ +
                                                        auVar97._0_4_ + auVar148._0_4_))));
      local_5ee0 = ZEXT1632(auVar97);
      auVar106 = vminps_avx(local_5ee0,ZEXT1632(auVar148));
      auVar106 = vminps_avx(auVar106,ZEXT1632(auVar16));
      local_5de0 = vandps_avx(local_5dc0,local_5c80);
      fVar116 = local_5de0._0_4_ * 1.1920929e-07;
      fVar128 = local_5de0._4_4_ * 1.1920929e-07;
      auVar52._4_4_ = fVar128;
      auVar52._0_4_ = fVar116;
      fVar130 = local_5de0._8_4_ * 1.1920929e-07;
      auVar52._8_4_ = fVar130;
      fVar132 = local_5de0._12_4_ * 1.1920929e-07;
      auVar52._12_4_ = fVar132;
      fVar134 = local_5de0._16_4_ * 1.1920929e-07;
      auVar52._16_4_ = fVar134;
      fVar136 = local_5de0._20_4_ * 1.1920929e-07;
      auVar52._20_4_ = fVar136;
      fVar138 = local_5de0._24_4_ * 1.1920929e-07;
      auVar52._24_4_ = fVar138;
      auVar52._28_4_ = 0x34000000;
      auVar126 = ZEXT3264(auVar52);
      auVar142._0_4_ = auVar167._0_4_ ^ (uint)fVar116;
      auVar142._4_4_ = auVar167._4_4_ ^ (uint)fVar128;
      auVar142._8_4_ = auVar167._8_4_ ^ (uint)fVar130;
      auVar142._12_4_ = auVar167._12_4_ ^ (uint)fVar132;
      auVar142._16_4_ = auVar167._16_4_ ^ (uint)fVar134;
      auVar142._20_4_ = auVar167._20_4_ ^ (uint)fVar136;
      auVar142._24_4_ = auVar167._24_4_ ^ (uint)fVar138;
      auVar142._28_4_ = auVar167._28_4_ ^ 0x34000000;
      auVar106 = vcmpps_avx(auVar106,auVar142,5);
      auVar144 = vmaxps_avx(local_5ee0,ZEXT1632(auVar148));
      auVar110 = vmaxps_avx(auVar144,ZEXT1632(auVar16));
      auVar110 = vcmpps_avx(auVar110,auVar52,2);
      auVar111 = vorps_avx(auVar106,auVar110);
      auVar147 = auVar125 & auVar111;
      bVar81 = true;
      auVar167 = ZEXT3264(local_5e60);
      local_5fa0._0_32_ = auVar125;
      if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar147 >> 0x7f,0) == '\0') &&
            (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0xbf,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar147[0x1f]) {
LAB_0060837a:
        auVar171 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar173 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
      }
      else {
        local_5e00 = ZEXT1632(auVar148);
        auVar53._4_4_ = fVar10 * local_5d40._4_4_;
        auVar53._0_4_ = fVar94 * local_5d40._0_4_;
        auVar53._8_4_ = fVar91 * local_5d40._8_4_;
        auVar53._12_4_ = fVar12 * local_5d40._12_4_;
        auVar53._16_4_ = fVar15 * local_5d40._16_4_;
        auVar53._20_4_ = fVar131 * local_5d40._20_4_;
        auVar53._24_4_ = fVar137 * local_5d40._24_4_;
        auVar53._28_4_ = auVar106._28_4_;
        auVar54._4_4_ = fVar176 * local_5d60._4_4_;
        auVar54._0_4_ = fVar174 * local_5d60._0_4_;
        auVar54._8_4_ = fVar177 * local_5d60._8_4_;
        auVar54._12_4_ = fVar178 * local_5d60._12_4_;
        auVar54._16_4_ = fVar179 * local_5d60._16_4_;
        auVar54._20_4_ = fVar180 * local_5d60._20_4_;
        auVar54._24_4_ = fVar181 * local_5d60._24_4_;
        auVar54._28_4_ = auVar110._28_4_;
        auVar16 = vfmsub213ps_fma(local_5d60,local_5da0,auVar53);
        auVar55._4_4_ = fVar9 * auVar160._4_4_;
        auVar55._0_4_ = fVar92 * auVar160._0_4_;
        auVar55._8_4_ = fVar115 * auVar160._8_4_;
        auVar55._12_4_ = fVar95 * auVar160._12_4_;
        auVar55._16_4_ = fVar14 * auVar160._16_4_;
        auVar55._20_4_ = fVar129 * auVar160._20_4_;
        auVar55._24_4_ = fVar135 * auVar160._24_4_;
        auVar55._28_4_ = 0x34000000;
        auVar56._4_4_ = fVar176 * auVar107._4_4_;
        auVar56._0_4_ = fVar174 * auVar107._0_4_;
        auVar56._8_4_ = fVar177 * auVar107._8_4_;
        auVar56._12_4_ = fVar178 * auVar107._12_4_;
        auVar56._16_4_ = fVar179 * auVar107._16_4_;
        auVar56._20_4_ = fVar180 * auVar107._20_4_;
        auVar56._24_4_ = fVar181 * auVar107._24_4_;
        auVar56._28_4_ = auVar144._28_4_;
        auVar17 = vfmsub213ps_fma(auVar107,local_5d80,auVar55);
        auVar106 = vandps_avx(auVar53,local_5c80);
        auVar110 = vandps_avx(auVar55,local_5c80);
        auVar106 = vcmpps_avx(auVar106,auVar110,1);
        auVar107 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar16),auVar106);
        auVar57._4_4_ = auVar86._4_4_ * fVar10;
        auVar57._0_4_ = auVar86._0_4_ * fVar94;
        auVar57._8_4_ = auVar86._8_4_ * fVar91;
        auVar57._12_4_ = auVar86._12_4_ * fVar12;
        auVar57._16_4_ = auVar86._16_4_ * fVar15;
        auVar57._20_4_ = auVar86._20_4_ * fVar131;
        auVar57._24_4_ = auVar86._24_4_ * fVar137;
        auVar57._28_4_ = auVar106._28_4_;
        auVar16 = vfmsub213ps_fma(auVar86,local_5da0,auVar56);
        auVar58._4_4_ = fVar9 * local_5d20._4_4_;
        auVar58._0_4_ = fVar92 * local_5d20._0_4_;
        auVar58._8_4_ = fVar115 * local_5d20._8_4_;
        auVar58._12_4_ = fVar95 * local_5d20._12_4_;
        auVar58._16_4_ = fVar14 * local_5d20._16_4_;
        auVar58._20_4_ = fVar129 * local_5d20._20_4_;
        auVar58._24_4_ = fVar135 * local_5d20._24_4_;
        auVar58._28_4_ = auVar110._28_4_;
        auVar17 = vfmsub213ps_fma(local_5d40,auVar163,auVar58);
        auVar106 = vandps_avx(auVar58,local_5c80);
        auVar110 = vandps_avx(auVar56,local_5c80);
        auVar106 = vcmpps_avx(auVar106,auVar110,1);
        auVar147 = vblendvps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17),auVar106);
        auVar16 = vfmsub213ps_fma(local_5d20,local_5d80,auVar54);
        auVar17 = vfmsub213ps_fma(auVar160,auVar163,auVar57);
        auVar152 = ZEXT1664(auVar17);
        auVar106 = vandps_avx(auVar54,local_5c80);
        auVar110 = vandps_avx(auVar57,local_5c80);
        auVar110 = vcmpps_avx(auVar106,auVar110,1);
        auVar163 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar16),auVar110);
        auVar59._4_4_ = auVar163._4_4_ * fVar96;
        auVar59._0_4_ = auVar163._0_4_ * fVar82;
        auVar59._8_4_ = auVar163._8_4_ * fVar11;
        auVar59._12_4_ = auVar163._12_4_ * fVar93;
        auVar59._16_4_ = auVar163._16_4_ * fVar13;
        auVar59._20_4_ = auVar163._20_4_ * fVar127;
        auVar59._24_4_ = auVar163._24_4_ * fVar133;
        auVar59._28_4_ = auVar110._28_4_;
        auVar16 = vfmadd213ps_fma(local_5ca0,auVar147,auVar59);
        auVar16 = vfmadd213ps_fma(_local_5f40,auVar107,ZEXT1632(auVar16));
        fVar82 = auVar16._0_4_ + auVar16._0_4_;
        fVar92 = auVar16._4_4_ + auVar16._4_4_;
        fVar94 = auVar16._8_4_ + auVar16._8_4_;
        fVar96 = auVar16._12_4_ + auVar16._12_4_;
        auVar86 = ZEXT1632(CONCAT412(fVar96,CONCAT48(fVar94,CONCAT44(fVar92,fVar82))));
        auVar60._4_4_ = auVar163._4_4_ * fVar183;
        auVar60._0_4_ = auVar163._0_4_ * fVar182;
        auVar60._8_4_ = auVar163._8_4_ * fVar184;
        auVar60._12_4_ = auVar163._12_4_ * fVar185;
        auVar60._16_4_ = auVar163._16_4_ * fVar186;
        auVar60._20_4_ = auVar163._20_4_ * fVar187;
        auVar60._24_4_ = auVar163._24_4_ * fVar188;
        auVar60._28_4_ = auVar106._28_4_;
        auVar16 = vfmadd213ps_fma(local_5ce0,auVar147,auVar60);
        auVar17 = vfmadd213ps_fma(local_5cc0,auVar107,ZEXT1632(auVar16));
        auVar106 = vrcpps_avx(auVar86);
        auVar146._8_4_ = 0x3f800000;
        auVar146._0_8_ = 0x3f8000003f800000;
        auVar146._12_4_ = 0x3f800000;
        auVar146._16_4_ = 0x3f800000;
        auVar146._20_4_ = 0x3f800000;
        auVar146._24_4_ = 0x3f800000;
        auVar146._28_4_ = 0x3f800000;
        auVar16 = vfnmadd213ps_fma(auVar106,auVar86,auVar146);
        auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar106,auVar106);
        auVar157._0_4_ = (auVar17._0_4_ + auVar17._0_4_) * auVar16._0_4_;
        auVar157._4_4_ = (auVar17._4_4_ + auVar17._4_4_) * auVar16._4_4_;
        auVar157._8_4_ = (auVar17._8_4_ + auVar17._8_4_) * auVar16._8_4_;
        auVar157._12_4_ = (auVar17._12_4_ + auVar17._12_4_) * auVar16._12_4_;
        auVar160 = ZEXT1632(auVar157);
        auVar161 = ZEXT3264(auVar160);
        auVar106 = *(undefined1 (*) [32])(ray + 0x100);
        auVar167 = ZEXT3264(auVar106);
        auVar110 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar160,2);
        auVar144 = vcmpps_avx(auVar160,auVar106,2);
        auVar110 = vandps_avx(auVar110,auVar144);
        auVar122._0_4_ = (uint)fVar82 ^ local_5f60._0_4_;
        auVar122._4_4_ = (uint)fVar92 ^ local_5f60._4_4_;
        auVar122._8_4_ = (uint)fVar94 ^ local_5f60._8_4_;
        auVar122._12_4_ = (uint)fVar96 ^ local_5f60._12_4_;
        auVar122._16_4_ = local_5f60._16_4_;
        auVar122._20_4_ = local_5f60._20_4_;
        auVar122._24_4_ = local_5f60._24_4_;
        auVar122._28_4_ = local_5f60._28_4_;
        auVar126 = ZEXT3264(auVar122);
        auVar144 = vcmpps_avx(auVar86,auVar122,4);
        auVar110 = vandps_avx(auVar144,auVar110);
        auVar144 = vandps_avx(auVar111,auVar125);
        auVar110 = vpslld_avx2(auVar110,0x1f);
        auVar111 = vpsrad_avx2(auVar110,0x1f);
        auVar110 = auVar144 & auVar111;
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0x7f,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0xbf,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar110[0x1f]) goto LAB_0060837a;
        auVar110 = vandps_avx(auVar111,auVar144);
        uVar4 = *(uint *)(unaff_R15 + uVar79 * 4);
        pGVar6 = (context->scene->geometries).items[uVar4].ptr;
        uVar5 = pGVar6->mask;
        auVar112._4_4_ = uVar5;
        auVar112._0_4_ = uVar5;
        auVar112._8_4_ = uVar5;
        auVar112._12_4_ = uVar5;
        auVar112._16_4_ = uVar5;
        auVar112._20_4_ = uVar5;
        auVar112._24_4_ = uVar5;
        auVar112._28_4_ = uVar5;
        auVar144 = vpand_avx2(auVar112,*(undefined1 (*) [32])(ray + 0x120));
        auVar111 = vpcmpeqd_avx2(auVar144,_DAT_01faff00);
        auVar144 = auVar110 & ~auVar111;
        auVar171 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar173 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        unaff_R15 = local_5fc0;
        if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar144 >> 0x7f,0) != '\0') ||
              (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0xbf,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar144[0x1f] < '\0') {
          uVar80 = *(undefined4 *)((long)&local_5e10 + uVar79 * 4);
          auVar125 = vandnps_avx(auVar111,auVar110);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar110 = vrcpps_avx(local_5dc0);
            auVar151._8_4_ = 0x3f800000;
            auVar151._0_8_ = 0x3f8000003f800000;
            auVar151._12_4_ = 0x3f800000;
            auVar151._16_4_ = 0x3f800000;
            auVar151._20_4_ = 0x3f800000;
            auVar151._24_4_ = 0x3f800000;
            auVar151._28_4_ = 0x3f800000;
            auVar16 = vfnmadd213ps_fma(local_5dc0,auVar110,auVar151);
            auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar110,auVar110);
            auVar89._8_4_ = 0x219392ef;
            auVar89._0_8_ = 0x219392ef219392ef;
            auVar89._12_4_ = 0x219392ef;
            auVar89._16_4_ = 0x219392ef;
            auVar89._20_4_ = 0x219392ef;
            auVar89._24_4_ = 0x219392ef;
            auVar89._28_4_ = 0x219392ef;
            auVar110 = vcmpps_avx(local_5de0,auVar89,5);
            auVar110 = vandps_avx(auVar110,ZEXT1632(auVar16));
            auVar63._4_4_ = auVar110._4_4_ * auVar97._4_4_;
            auVar63._0_4_ = auVar110._0_4_ * auVar97._0_4_;
            auVar63._8_4_ = auVar110._8_4_ * auVar97._8_4_;
            auVar63._12_4_ = auVar110._12_4_ * auVar97._12_4_;
            auVar63._16_4_ = auVar110._16_4_ * 0.0;
            auVar63._20_4_ = auVar110._20_4_ * 0.0;
            auVar63._24_4_ = auVar110._24_4_ * 0.0;
            auVar63._28_4_ = local_5de0._28_4_;
            auVar144 = vminps_avx(auVar63,auVar151);
            auVar64._4_4_ = auVar110._4_4_ * auVar148._4_4_;
            auVar64._0_4_ = auVar110._0_4_ * auVar148._0_4_;
            auVar64._8_4_ = auVar110._8_4_ * auVar148._8_4_;
            auVar64._12_4_ = auVar110._12_4_ * auVar148._12_4_;
            auVar64._16_4_ = auVar110._16_4_ * 0.0;
            auVar64._20_4_ = auVar110._20_4_ * 0.0;
            auVar64._24_4_ = auVar110._24_4_ * 0.0;
            auVar64._28_4_ = auVar110._28_4_;
            auVar110 = vminps_avx(auVar64,auVar151);
            auVar111 = vsubps_avx(auVar151,auVar144);
            auVar86 = vsubps_avx(auVar151,auVar110);
            auVar68._8_8_ = uStack_5958;
            auVar68._0_8_ = local_5960;
            auVar68._16_8_ = uStack_5950;
            auVar68._24_8_ = uStack_5948;
            local_5c00 = vblendvps_avx(auVar144,auVar111,auVar68);
            local_5be0 = vblendvps_avx(auVar110,auVar86,auVar68);
            pRVar7 = context->user;
            auVar148._4_4_ = uVar80;
            auVar148._0_4_ = uVar80;
            auVar148._8_4_ = uVar80;
            auVar148._12_4_ = uVar80;
            local_5bc0._16_4_ = uVar80;
            local_5bc0._0_16_ = auVar148;
            local_5bc0._20_4_ = uVar80;
            local_5bc0._24_4_ = uVar80;
            local_5bc0._28_4_ = uVar80;
            auVar152 = ZEXT3264(local_5bc0);
            local_5c60[0] = (RTCHitN)auVar107[0];
            local_5c60[1] = (RTCHitN)auVar107[1];
            local_5c60[2] = (RTCHitN)auVar107[2];
            local_5c60[3] = (RTCHitN)auVar107[3];
            local_5c60[4] = (RTCHitN)auVar107[4];
            local_5c60[5] = (RTCHitN)auVar107[5];
            local_5c60[6] = (RTCHitN)auVar107[6];
            local_5c60[7] = (RTCHitN)auVar107[7];
            local_5c60[8] = (RTCHitN)auVar107[8];
            local_5c60[9] = (RTCHitN)auVar107[9];
            local_5c60[10] = (RTCHitN)auVar107[10];
            local_5c60[0xb] = (RTCHitN)auVar107[0xb];
            local_5c60[0xc] = (RTCHitN)auVar107[0xc];
            local_5c60[0xd] = (RTCHitN)auVar107[0xd];
            local_5c60[0xe] = (RTCHitN)auVar107[0xe];
            local_5c60[0xf] = (RTCHitN)auVar107[0xf];
            local_5c60[0x10] = (RTCHitN)auVar107[0x10];
            local_5c60[0x11] = (RTCHitN)auVar107[0x11];
            local_5c60[0x12] = (RTCHitN)auVar107[0x12];
            local_5c60[0x13] = (RTCHitN)auVar107[0x13];
            local_5c60[0x14] = (RTCHitN)auVar107[0x14];
            local_5c60[0x15] = (RTCHitN)auVar107[0x15];
            local_5c60[0x16] = (RTCHitN)auVar107[0x16];
            local_5c60[0x17] = (RTCHitN)auVar107[0x17];
            local_5c60[0x18] = (RTCHitN)auVar107[0x18];
            local_5c60[0x19] = (RTCHitN)auVar107[0x19];
            local_5c60[0x1a] = (RTCHitN)auVar107[0x1a];
            local_5c60[0x1b] = (RTCHitN)auVar107[0x1b];
            local_5c60[0x1c] = (RTCHitN)auVar107[0x1c];
            local_5c60[0x1d] = (RTCHitN)auVar107[0x1d];
            local_5c60[0x1e] = (RTCHitN)auVar107[0x1e];
            local_5c60[0x1f] = (RTCHitN)auVar107[0x1f];
            local_5c40 = auVar147;
            local_5c20 = auVar163;
            local_5ba0 = uVar4;
            uStack_5b9c = uVar4;
            uStack_5b98 = uVar4;
            uStack_5b94 = uVar4;
            uStack_5b90 = uVar4;
            uStack_5b8c = uVar4;
            uStack_5b88 = uVar4;
            uStack_5b84 = uVar4;
            auVar144 = vpcmpeqd_avx2(local_5c00,local_5c00);
            local_5f18[1] = auVar144;
            *local_5f18 = auVar144;
            local_5b80 = pRVar7->instID[0];
            uStack_5b7c = local_5b80;
            uStack_5b78 = local_5b80;
            uStack_5b74 = local_5b80;
            uStack_5b70 = local_5b80;
            uStack_5b6c = local_5b80;
            uStack_5b68 = local_5b80;
            uStack_5b64 = local_5b80;
            local_5b60 = pRVar7->instPrimID[0];
            uStack_5b5c = local_5b60;
            uStack_5b58 = local_5b60;
            uStack_5b54 = local_5b60;
            uStack_5b50 = local_5b60;
            uStack_5b4c = local_5b60;
            uStack_5b48 = local_5b60;
            uStack_5b44 = local_5b60;
            auVar110 = vblendvps_avx(auVar106,auVar160,auVar125);
            *(undefined1 (*) [32])(ray + 0x100) = auVar110;
            local_5f10.valid = (int *)local_5ec0;
            local_5f10.geometryUserPtr = pGVar6->userPtr;
            local_5f10.context = context->user;
            local_5f10.hit = local_5c60;
            local_5f10.N = 8;
            local_5f10.ray = (RTCRayN *)ray;
            local_5ec0 = auVar125;
            if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              local_5f40 = auVar76;
              auVar152 = ZEXT1664(auVar148);
              auVar161 = ZEXT1664(auVar157);
              local_5f60 = auVar106;
              (*pGVar6->occlusionFilterN)(&local_5f10);
              auVar171._8_56_ = extraout_var;
              auVar171._0_8_ = extraout_XMM1_Qa;
              auVar167 = ZEXT3264(local_5f60);
              auVar144 = vpcmpeqd_avx2(auVar171._0_32_,auVar171._0_32_);
              auVar173 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                            CONCAT424(0x3f7ffffa,
                                                      CONCAT420(0x3f7ffffa,
                                                                CONCAT416(0x3f7ffffa,
                                                                          CONCAT412(0x3f7ffffa,
                                                                                    CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              auVar171 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar76 = local_5f40;
              uVar77 = local_5fb8;
              ray = local_5fb0;
              context = local_5fa8;
            }
            auVar125 = vpcmpeqd_avx2(local_5ec0,_DAT_01faff00);
            auVar106 = auVar144 & ~auVar125;
            if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar106 >> 0x7f,0) == '\0') &&
                  (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar106 >> 0xbf,0) == '\0') &&
                (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar106[0x1f]) {
              auVar125 = auVar125 ^ auVar144;
            }
            else {
              p_Var8 = context->args->filter;
              if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                local_5f60 = auVar167._0_32_;
                auVar152 = ZEXT1664(auVar152._0_16_);
                auVar161 = ZEXT1664(auVar161._0_16_);
                (*p_Var8)(&local_5f10);
                auVar167 = ZEXT3264(local_5f60);
                auVar173 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar171 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                uVar77 = local_5fb8;
                ray = local_5fb0;
                context = local_5fa8;
              }
              auVar106 = vpcmpeqd_avx2(local_5ec0,_DAT_01faff00);
              auVar125 = auVar106 ^ _DAT_01fe9960;
              auVar113._8_4_ = 0xff800000;
              auVar113._0_8_ = 0xff800000ff800000;
              auVar113._12_4_ = 0xff800000;
              auVar113._16_4_ = 0xff800000;
              auVar113._20_4_ = 0xff800000;
              auVar113._24_4_ = 0xff800000;
              auVar113._28_4_ = 0xff800000;
              auVar106 = vblendvps_avx(auVar113,*(undefined1 (*) [32])(local_5f10.ray + 0x100),
                                       auVar106);
              *(undefined1 (*) [32])(local_5f10.ray + 0x100) = auVar106;
            }
            auVar106 = vblendvps_avx(auVar167._0_32_,*(undefined1 (*) [32])local_5f68,auVar125);
            *(undefined1 (*) [32])local_5f68 = auVar106;
          }
          auVar126 = ZEXT3264(auVar125);
          auVar106 = local_5fa0._0_32_ & ~auVar125;
          auVar125 = vandnps_avx(auVar125,local_5fa0._0_32_);
          bVar81 = (((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar106 >> 0x7f,0) != '\0') ||
                     (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar106 >> 0xbf,0) != '\0') ||
                   (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar106[0x1f] < '\0';
          unaff_R15 = local_5fc0;
        }
      }
      if ((!bVar81) || (bVar81 = 2 < uVar79, uVar79 = uVar79 + 1, bVar81)) break;
    }
    auVar104 = vandps_avx(auVar125,local_5e80);
    auVar125 = local_5e80 & auVar125;
    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar125 >> 0x7f,0) == '\0') &&
          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar125 >> 0xbf,0) == '\0') &&
        (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar125[0x1f])
    break;
  }
  auVar125 = vpcmpeqd_avx2(auVar126._0_32_,auVar126._0_32_);
  auVar90._0_4_ = auVar104._0_4_ ^ auVar125._0_4_;
  auVar90._4_4_ = auVar104._4_4_ ^ auVar125._4_4_;
  auVar90._8_4_ = auVar104._8_4_ ^ auVar125._8_4_;
  auVar90._12_4_ = auVar104._12_4_ ^ auVar125._12_4_;
  auVar90._16_4_ = auVar104._16_4_ ^ auVar125._16_4_;
  auVar90._20_4_ = auVar104._20_4_ ^ auVar125._20_4_;
  auVar90._24_4_ = auVar104._24_4_ ^ auVar125._24_4_;
  auVar90._28_4_ = auVar104._28_4_ ^ auVar125._28_4_;
LAB_006085bc:
  local_5e40 = vorps_avx(local_5e40,auVar90);
  auVar125 = auVar125 & ~local_5e40;
  if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar125 >> 0x7f,0) == '\0') &&
        (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar125 >> 0xbf,0) == '\0') &&
      (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar125[0x1f])
  goto LAB_006086e3;
  auVar124._8_4_ = 0xff800000;
  auVar124._0_8_ = 0xff800000ff800000;
  auVar124._12_4_ = 0xff800000;
  auVar124._16_4_ = 0xff800000;
  auVar124._20_4_ = 0xff800000;
  auVar124._24_4_ = 0xff800000;
  auVar124._28_4_ = 0xff800000;
  auVar126 = ZEXT3264(auVar124);
  local_59a0 = vblendvps_avx(local_59a0,auVar124,local_5e40);
  goto LAB_00607334;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }